

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  void *pvVar14;
  __int_type_conflict _Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  LinearSpace3fa *pLVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  byte bVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  bool bVar69;
  ulong uVar70;
  bool bVar71;
  float t1;
  float fVar72;
  undefined4 uVar73;
  float fVar74;
  float fVar94;
  float fVar96;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar95;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar97;
  undefined8 uVar98;
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar119;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  float fVar156;
  vfloat4 b0;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar185;
  float fVar186;
  vfloat4 b0_1;
  undefined1 auVar172 [16];
  float fVar187;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar190 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar200;
  undefined1 auVar197 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar204;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar217;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar218;
  vfloat4 a0_2;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar234;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  float fVar233;
  undefined1 in_ZMM9 [64];
  undefined1 auVar232 [64];
  vfloat4 a0_3;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  vfloat4 a0_1;
  undefined1 auVar256 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar255 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar264;
  float fVar276;
  float fVar277;
  vfloat4 a0;
  undefined1 auVar265 [16];
  float fVar278;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar293 [32];
  vfloat_impl<4> p00;
  undefined1 local_628 [8];
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined1 local_578 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_538 [16];
  undefined1 (*local_520) [16];
  LinearSpace3fa *local_518;
  ulong local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_268 [16];
  undefined1 local_258 [16];
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar292 [32];
  
  PVar10 = prim[1];
  uVar63 = (ulong)(byte)PVar10;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar72 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar75._0_4_ = fVar72 * auVar16._0_4_;
  auVar75._4_4_ = fVar72 * auVar16._4_4_;
  auVar75._8_4_ = fVar72 * auVar16._8_4_;
  auVar75._12_4_ = fVar72 * auVar16._12_4_;
  auVar157._0_4_ = fVar72 * auVar17._0_4_;
  auVar157._4_4_ = fVar72 * auVar17._4_4_;
  auVar157._8_4_ = fVar72 * auVar17._8_4_;
  auVar157._12_4_ = fVar72 * auVar17._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar63 * 4 + 6);
  auVar90 = vpmovsxbd_avx2(auVar16);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar63 * 5 + 6);
  auVar18 = vpmovsxbd_avx2(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar63 * 6 + 6);
  auVar19 = vpmovsxbd_avx2(auVar4);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar20 = vpmovsxbd_avx2(auVar5);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar63 * 0xc + 6);
  auVar21 = vpmovsxbd_avx2(auVar6);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar22 = vpmovsxbd_avx2(auVar7);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar23 = vpmovsxbd_avx2(auVar8);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar63 * 0x13 + 6);
  auVar263 = vpmovsxbd_avx2(auVar220);
  auVar263 = vcvtdq2ps_avx(auVar263);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar63 * 0x14 + 6);
  auVar24 = vpmovsxbd_avx2(auVar9);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar273._4_4_ = auVar157._0_4_;
  auVar273._0_4_ = auVar157._0_4_;
  auVar273._8_4_ = auVar157._0_4_;
  auVar273._12_4_ = auVar157._0_4_;
  auVar273._16_4_ = auVar157._0_4_;
  auVar273._20_4_ = auVar157._0_4_;
  auVar273._24_4_ = auVar157._0_4_;
  auVar273._28_4_ = auVar157._0_4_;
  auVar16 = vmovshdup_avx(auVar157);
  uVar98 = auVar16._0_8_;
  auVar290._8_8_ = uVar98;
  auVar290._0_8_ = uVar98;
  auVar290._16_8_ = uVar98;
  auVar290._24_8_ = uVar98;
  auVar16 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar72 = auVar16._0_4_;
  auVar246._0_4_ = fVar72 * auVar19._0_4_;
  fVar94 = auVar16._4_4_;
  auVar246._4_4_ = fVar94 * auVar19._4_4_;
  auVar246._8_4_ = fVar72 * auVar19._8_4_;
  auVar246._12_4_ = fVar94 * auVar19._12_4_;
  auVar246._16_4_ = fVar72 * auVar19._16_4_;
  auVar246._20_4_ = fVar94 * auVar19._20_4_;
  auVar246._28_36_ = in_ZMM10._28_36_;
  auVar246._24_4_ = fVar72 * auVar19._24_4_;
  auVar232._0_4_ = auVar22._0_4_ * fVar72;
  auVar232._4_4_ = auVar22._4_4_ * fVar94;
  auVar232._8_4_ = auVar22._8_4_ * fVar72;
  auVar232._12_4_ = auVar22._12_4_ * fVar94;
  auVar232._16_4_ = auVar22._16_4_ * fVar72;
  auVar232._20_4_ = auVar22._20_4_ * fVar94;
  auVar232._28_36_ = in_ZMM9._28_36_;
  auVar232._24_4_ = auVar22._24_4_ * fVar72;
  auVar193._0_4_ = auVar24._0_4_ * fVar72;
  auVar193._4_4_ = auVar24._4_4_ * fVar94;
  auVar193._8_4_ = auVar24._8_4_ * fVar72;
  auVar193._12_4_ = auVar24._12_4_ * fVar94;
  auVar193._16_4_ = auVar24._16_4_ * fVar72;
  auVar193._20_4_ = auVar24._20_4_ * fVar94;
  auVar193._24_4_ = auVar24._24_4_ * fVar72;
  auVar193._28_4_ = 0;
  auVar16 = vfmadd231ps_fma(auVar246._0_32_,auVar290,auVar18);
  auVar17 = vfmadd231ps_fma(auVar232._0_32_,auVar290,auVar21);
  auVar4 = vfmadd231ps_fma(auVar193,auVar263,auVar290);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar273,auVar90);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar273,auVar20);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar23,auVar273);
  auVar274._4_4_ = auVar75._0_4_;
  auVar274._0_4_ = auVar75._0_4_;
  auVar274._8_4_ = auVar75._0_4_;
  auVar274._12_4_ = auVar75._0_4_;
  auVar274._16_4_ = auVar75._0_4_;
  auVar274._20_4_ = auVar75._0_4_;
  auVar274._24_4_ = auVar75._0_4_;
  auVar274._28_4_ = auVar75._0_4_;
  auVar16 = vmovshdup_avx(auVar75);
  uVar98 = auVar16._0_8_;
  auVar291._8_8_ = uVar98;
  auVar291._0_8_ = uVar98;
  auVar291._16_8_ = uVar98;
  auVar291._24_8_ = uVar98;
  auVar16 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar72 = auVar16._0_4_;
  auVar169._0_4_ = fVar72 * auVar19._0_4_;
  fVar94 = auVar16._4_4_;
  auVar169._4_4_ = fVar94 * auVar19._4_4_;
  auVar169._8_4_ = fVar72 * auVar19._8_4_;
  auVar169._12_4_ = fVar94 * auVar19._12_4_;
  auVar169._16_4_ = fVar72 * auVar19._16_4_;
  auVar169._20_4_ = fVar94 * auVar19._20_4_;
  auVar169._24_4_ = fVar72 * auVar19._24_4_;
  auVar169._28_4_ = 0;
  auVar28._4_4_ = auVar22._4_4_ * fVar94;
  auVar28._0_4_ = auVar22._0_4_ * fVar72;
  auVar28._8_4_ = auVar22._8_4_ * fVar72;
  auVar28._12_4_ = auVar22._12_4_ * fVar94;
  auVar28._16_4_ = auVar22._16_4_ * fVar72;
  auVar28._20_4_ = auVar22._20_4_ * fVar94;
  auVar28._24_4_ = auVar22._24_4_ * fVar72;
  auVar28._28_4_ = auVar19._28_4_;
  auVar19._4_4_ = auVar24._4_4_ * fVar94;
  auVar19._0_4_ = auVar24._0_4_ * fVar72;
  auVar19._8_4_ = auVar24._8_4_ * fVar72;
  auVar19._12_4_ = auVar24._12_4_ * fVar94;
  auVar19._16_4_ = auVar24._16_4_ * fVar72;
  auVar19._20_4_ = auVar24._20_4_ * fVar94;
  auVar19._24_4_ = auVar24._24_4_ * fVar72;
  auVar19._28_4_ = fVar94;
  auVar16 = vfmadd231ps_fma(auVar169,auVar291,auVar18);
  auVar6 = vfmadd231ps_fma(auVar28,auVar291,auVar21);
  auVar7 = vfmadd231ps_fma(auVar19,auVar291,auVar263);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar274,auVar90);
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar274,auVar20);
  auVar90 = vandps_avx(ZEXT1632(auVar5),auVar132);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar213._16_4_ = 0x219392ef;
  auVar213._20_4_ = 0x219392ef;
  auVar213._24_4_ = 0x219392ef;
  auVar213._28_4_ = 0x219392ef;
  auVar90 = vcmpps_avx(auVar90,auVar213,1);
  auVar18 = vblendvps_avx(ZEXT1632(auVar5),auVar213,auVar90);
  auVar90 = vandps_avx(ZEXT1632(auVar17),auVar132);
  auVar90 = vcmpps_avx(auVar90,auVar213,1);
  auVar19 = vblendvps_avx(ZEXT1632(auVar17),auVar213,auVar90);
  auVar90 = vandps_avx(ZEXT1632(auVar4),auVar132);
  auVar90 = vcmpps_avx(auVar90,auVar213,1);
  auVar20 = vrcpps_avx(auVar18);
  auVar90 = vblendvps_avx(ZEXT1632(auVar4),auVar213,auVar90);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = 0x3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar194._16_4_ = 0x3f800000;
  auVar194._20_4_ = 0x3f800000;
  auVar194._24_4_ = 0x3f800000;
  auVar194._28_4_ = 0x3f800000;
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar274,auVar23);
  auVar21 = vrcpps_avx(auVar19);
  auVar16 = vfnmadd213ps_fma(auVar18,auVar20,auVar194);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar20,auVar20);
  auVar17 = vfnmadd213ps_fma(auVar19,auVar21,auVar194);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar21,auVar21);
  auVar18 = vrcpps_avx(auVar90);
  auVar4 = vfnmadd213ps_fma(auVar90,auVar18,auVar194);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar18,auVar18);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 7 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar8));
  auVar20._4_4_ = auVar16._4_4_ * auVar90._4_4_;
  auVar20._0_4_ = auVar16._0_4_ * auVar90._0_4_;
  auVar20._8_4_ = auVar16._8_4_ * auVar90._8_4_;
  auVar20._12_4_ = auVar16._12_4_ * auVar90._12_4_;
  auVar20._16_4_ = auVar90._16_4_ * 0.0;
  auVar20._20_4_ = auVar90._20_4_ * 0.0;
  auVar20._24_4_ = auVar90._24_4_ * 0.0;
  auVar20._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 9 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar8));
  auVar21._4_4_ = auVar16._4_4_ * auVar90._4_4_;
  auVar21._0_4_ = auVar16._0_4_ * auVar90._0_4_;
  auVar21._8_4_ = auVar16._8_4_ * auVar90._8_4_;
  auVar21._12_4_ = auVar16._12_4_ * auVar90._12_4_;
  auVar21._16_4_ = auVar90._16_4_ * 0.0;
  auVar21._20_4_ = auVar90._20_4_ * 0.0;
  auVar21._24_4_ = auVar90._24_4_ * 0.0;
  auVar21._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 0xe + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar6));
  auVar22._4_4_ = auVar17._4_4_ * auVar90._4_4_;
  auVar22._0_4_ = auVar17._0_4_ * auVar90._0_4_;
  auVar22._8_4_ = auVar17._8_4_ * auVar90._8_4_;
  auVar22._12_4_ = auVar17._12_4_ * auVar90._12_4_;
  auVar22._16_4_ = auVar90._16_4_ * 0.0;
  auVar22._20_4_ = auVar90._20_4_ * 0.0;
  auVar22._24_4_ = auVar90._24_4_ * 0.0;
  auVar22._28_4_ = auVar90._28_4_;
  auVar114._1_3_ = 0;
  auVar114[0] = PVar10;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar6));
  auVar23._4_4_ = auVar17._4_4_ * auVar90._4_4_;
  auVar23._0_4_ = auVar17._0_4_ * auVar90._0_4_;
  auVar23._8_4_ = auVar17._8_4_ * auVar90._8_4_;
  auVar23._12_4_ = auVar17._12_4_ * auVar90._12_4_;
  auVar23._16_4_ = auVar90._16_4_ * 0.0;
  auVar23._20_4_ = auVar90._20_4_ * 0.0;
  auVar23._24_4_ = auVar90._24_4_ * 0.0;
  auVar23._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 0x15 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar5));
  auVar263._4_4_ = auVar90._4_4_ * auVar4._4_4_;
  auVar263._0_4_ = auVar90._0_4_ * auVar4._0_4_;
  auVar263._8_4_ = auVar90._8_4_ * auVar4._8_4_;
  auVar263._12_4_ = auVar90._12_4_ * auVar4._12_4_;
  auVar263._16_4_ = auVar90._16_4_ * 0.0;
  auVar263._20_4_ = auVar90._20_4_ * 0.0;
  auVar263._24_4_ = auVar90._24_4_ * 0.0;
  auVar263._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 * 0x17 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar5));
  auVar24._4_4_ = auVar4._4_4_ * auVar90._4_4_;
  auVar24._0_4_ = auVar4._0_4_ * auVar90._0_4_;
  auVar24._8_4_ = auVar4._8_4_ * auVar90._8_4_;
  auVar24._12_4_ = auVar4._12_4_ * auVar90._12_4_;
  auVar24._16_4_ = auVar90._16_4_ * 0.0;
  auVar24._20_4_ = auVar90._20_4_ * 0.0;
  auVar24._24_4_ = auVar90._24_4_ * 0.0;
  auVar24._28_4_ = auVar90._28_4_;
  auVar90 = vpminsd_avx2(auVar20,auVar21);
  auVar18 = vpminsd_avx2(auVar22,auVar23);
  auVar90 = vmaxps_avx(auVar90,auVar18);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar214._4_4_ = uVar73;
  auVar214._0_4_ = uVar73;
  auVar214._8_4_ = uVar73;
  auVar214._12_4_ = uVar73;
  auVar214._16_4_ = uVar73;
  auVar214._20_4_ = uVar73;
  auVar214._24_4_ = uVar73;
  auVar214._28_4_ = uVar73;
  auVar18 = vpminsd_avx2(auVar263,auVar24);
  auVar18 = vmaxps_avx(auVar18,auVar214);
  auVar90 = vmaxps_avx(auVar90,auVar18);
  local_1d8._4_4_ = auVar90._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar90._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar90._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar90._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar90._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar90._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar90._24_4_ * 0.99999964;
  local_1d8._28_4_ = auVar18._28_4_;
  auVar90 = vpmaxsd_avx2(auVar20,auVar21);
  auVar18 = vpmaxsd_avx2(auVar22,auVar23);
  auVar90 = vminps_avx(auVar90,auVar18);
  auVar18 = vpmaxsd_avx2(auVar263,auVar24);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar133._4_4_ = uVar73;
  auVar133._0_4_ = uVar73;
  auVar133._8_4_ = uVar73;
  auVar133._12_4_ = uVar73;
  auVar133._16_4_ = uVar73;
  auVar133._20_4_ = uVar73;
  auVar133._24_4_ = uVar73;
  auVar133._28_4_ = uVar73;
  auVar18 = vminps_avx(auVar18,auVar133);
  auVar90 = vminps_avx(auVar90,auVar18);
  auVar29._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar29._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar29._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar29._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar29._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar29._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar29._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar29._28_4_ = auVar90._28_4_;
  auVar114[4] = PVar10;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar10;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar10;
  auVar114._13_3_ = 0;
  auVar114[0x10] = PVar10;
  auVar114._17_3_ = 0;
  auVar114[0x14] = PVar10;
  auVar114._21_3_ = 0;
  auVar114[0x18] = PVar10;
  auVar114._25_3_ = 0;
  auVar114[0x1c] = PVar10;
  auVar114._29_3_ = 0;
  auVar18 = vpcmpgtd_avx2(auVar114,_DAT_01fb4ba0);
  auVar90 = vcmpps_avx(local_1d8,auVar29,2);
  auVar90 = vandps_avx(auVar90,auVar18);
  uVar67 = vmovmskps_avx(auVar90);
  local_518 = pre->ray_space + k;
  auVar90._16_16_ = mm_lookupmask_ps._240_16_;
  auVar90._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar90,ZEXT832(0) << 0x20,0x80);
  local_520 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_0135c737:
  pLVar61 = local_518;
  local_510 = (ulong)uVar67;
  if (local_510 == 0) {
LAB_0135e3a1:
    return local_510 != 0;
  }
  lVar64 = 0;
  for (uVar63 = local_510; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar67 = *(uint *)(prim + 2);
  uVar11 = *(uint *)(prim + lVar64 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar67].ptr;
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar11);
  p_Var13 = pGVar12[1].intersectionFilterN;
  pvVar14 = pGVar12[2].userPtr;
  _Var15 = pGVar12[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var15 + uVar63 * (long)pvVar14);
  auVar16 = *(undefined1 (*) [16])(_Var15 + (uVar63 + 1) * (long)pvVar14);
  auVar17 = *(undefined1 (*) [16])(_Var15 + (uVar63 + 2) * (long)pvVar14);
  pfVar1 = (float *)(_Var15 + (long)pvVar14 * (uVar63 + 3));
  fVar72 = *pfVar1;
  fVar94 = pfVar1[1];
  fVar97 = pfVar1[2];
  fVar119 = pfVar1[3];
  lVar64 = *(long *)&pGVar12[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar64 + (long)p_Var13 * uVar63);
  auVar5 = *(undefined1 (*) [16])(lVar64 + (long)p_Var13 * (uVar63 + 1));
  auVar6 = *(undefined1 (*) [16])(lVar64 + (long)p_Var13 * (uVar63 + 2));
  uVar70 = local_510 - 1 & local_510;
  pfVar1 = (float *)(lVar64 + (long)p_Var13 * (uVar63 + 3));
  fVar171 = *pfVar1;
  fVar185 = pfVar1[1];
  fVar186 = pfVar1[2];
  fVar187 = pfVar1[3];
  if (uVar70 != 0) {
    uVar68 = uVar70 - 1 & uVar70;
    for (uVar63 = uVar70; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    }
    if (uVar68 != 0) {
      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar285._8_4_ = 0x80000000;
  auVar285._0_8_ = 0x8000000080000000;
  auVar285._12_4_ = 0x80000000;
  auVar135._0_4_ = fVar171 * -0.0;
  auVar135._4_4_ = fVar185 * -0.0;
  auVar135._8_4_ = fVar186 * -0.0;
  auVar135._12_4_ = fVar187 * -0.0;
  auVar220 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar6,auVar135);
  auVar76._0_4_ = auVar5._0_4_ + auVar220._0_4_;
  auVar76._4_4_ = auVar5._4_4_ + auVar220._4_4_;
  auVar76._8_4_ = auVar5._8_4_ + auVar220._8_4_;
  auVar76._12_4_ = auVar5._12_4_ + auVar220._12_4_;
  auVar9 = vfmadd231ps_fma(auVar76,auVar4,auVar285);
  auVar99._12_4_ = 0;
  auVar99._0_12_ = ZEXT812(0);
  auVar99 = auVar99 << 0x20;
  auVar120._0_4_ = fVar171 * 0.0;
  auVar120._4_4_ = fVar185 * 0.0;
  auVar120._8_4_ = fVar186 * 0.0;
  auVar120._12_4_ = fVar187 * 0.0;
  auVar205._8_4_ = 0x3f000000;
  auVar205._0_8_ = 0x3f0000003f000000;
  auVar205._12_4_ = 0x3f000000;
  auVar220 = vfmadd231ps_fma(auVar120,auVar6,auVar205);
  auVar220 = vfmadd231ps_fma(auVar220,auVar5,auVar99);
  auVar78 = vfnmadd231ps_fma(auVar220,auVar4,auVar205);
  auVar279._0_4_ = fVar72 * -0.0;
  auVar279._4_4_ = fVar94 * -0.0;
  auVar279._8_4_ = fVar97 * -0.0;
  auVar279._12_4_ = fVar119 * -0.0;
  auVar220 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar17,auVar279);
  auVar265._0_4_ = auVar16._0_4_ + auVar220._0_4_;
  auVar265._4_4_ = auVar16._4_4_ + auVar220._4_4_;
  auVar265._8_4_ = auVar16._8_4_ + auVar220._8_4_;
  auVar265._12_4_ = auVar16._12_4_ + auVar220._12_4_;
  auVar220 = vfmadd231ps_fma(auVar265,auVar7,auVar285);
  auVar253._0_4_ = fVar72 * 0.0;
  auVar253._4_4_ = fVar94 * 0.0;
  auVar253._8_4_ = fVar97 * 0.0;
  auVar253._12_4_ = fVar119 * 0.0;
  auVar75 = vfmadd231ps_fma(auVar253,auVar17,auVar205);
  auVar75 = vfmadd231ps_fma(auVar75,auVar16,auVar99);
  auVar76 = vfnmadd231ps_fma(auVar75,auVar7,auVar205);
  auVar136._0_4_ = auVar6._0_4_ + auVar135._0_4_;
  auVar136._4_4_ = auVar6._4_4_ + auVar135._4_4_;
  auVar136._8_4_ = auVar6._8_4_ + auVar135._8_4_;
  auVar136._12_4_ = auVar6._12_4_ + auVar135._12_4_;
  auVar75 = vfmadd231ps_fma(auVar136,auVar5,auVar99);
  auVar75 = vfmadd231ps_fma(auVar75,auVar4,auVar285);
  auVar148._0_4_ = fVar171 * 0.5;
  auVar148._4_4_ = fVar185 * 0.5;
  auVar148._8_4_ = fVar186 * 0.5;
  auVar148._12_4_ = fVar187 * 0.5;
  auVar6 = vfmadd231ps_fma(auVar148,auVar99,auVar6);
  auVar5 = vfnmadd231ps_fma(auVar6,auVar205,auVar5);
  auVar157 = vfmadd231ps_fma(auVar5,auVar99,auVar4);
  auVar219._0_4_ = auVar279._0_4_ + auVar17._0_4_;
  auVar219._4_4_ = auVar279._4_4_ + auVar17._4_4_;
  auVar219._8_4_ = auVar279._8_4_ + auVar17._8_4_;
  auVar219._12_4_ = auVar279._12_4_ + auVar17._12_4_;
  auVar4 = vfmadd231ps_fma(auVar219,auVar16,auVar99);
  auVar6 = vfmadd231ps_fma(auVar4,auVar7,auVar285);
  auVar235._0_4_ = fVar72 * 0.5;
  auVar235._4_4_ = fVar94 * 0.5;
  auVar235._8_4_ = fVar97 * 0.5;
  auVar235._12_4_ = fVar119 * 0.5;
  auVar17 = vfmadd231ps_fma(auVar235,auVar99,auVar17);
  auVar16 = vfnmadd231ps_fma(auVar17,auVar205,auVar16);
  auVar7 = vfmadd231ps_fma(auVar16,auVar99,auVar7);
  auVar16 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar17 = vshufps_avx(auVar220,auVar220,0xc9);
  fVar134 = auVar78._0_4_;
  auVar162._0_4_ = fVar134 * auVar17._0_4_;
  fVar95 = auVar78._4_4_;
  auVar162._4_4_ = fVar95 * auVar17._4_4_;
  fVar96 = auVar78._8_4_;
  auVar162._8_4_ = fVar96 * auVar17._8_4_;
  fVar156 = auVar78._12_4_;
  auVar162._12_4_ = fVar156 * auVar17._12_4_;
  auVar17 = vfmsub231ps_fma(auVar162,auVar16,auVar220);
  auVar4 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar17 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar172._0_4_ = fVar134 * auVar17._0_4_;
  auVar172._4_4_ = fVar95 * auVar17._4_4_;
  auVar172._8_4_ = fVar96 * auVar17._8_4_;
  auVar172._12_4_ = fVar156 * auVar17._12_4_;
  auVar16 = vfmsub231ps_fma(auVar172,auVar16,auVar76);
  auVar5 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar17 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar16 = vshufps_avx(auVar6,auVar6,0xc9);
  fVar74 = auVar157._0_4_;
  auVar158._0_4_ = fVar74 * auVar16._0_4_;
  fVar234 = auVar157._4_4_;
  auVar158._4_4_ = fVar234 * auVar16._4_4_;
  fVar146 = auVar157._8_4_;
  auVar158._8_4_ = fVar146 * auVar16._8_4_;
  fVar147 = auVar157._12_4_;
  auVar158._12_4_ = fVar147 * auVar16._12_4_;
  auVar16 = vfmsub231ps_fma(auVar158,auVar17,auVar6);
  auVar6 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar16 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar188._0_4_ = fVar74 * auVar16._0_4_;
  auVar188._4_4_ = fVar234 * auVar16._4_4_;
  auVar188._8_4_ = fVar146 * auVar16._8_4_;
  auVar188._12_4_ = fVar147 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar4,auVar4,0x7f);
  auVar17 = vfmsub231ps_fma(auVar188,auVar17,auVar7);
  auVar7 = vshufps_avx(auVar17,auVar17,0xc9);
  fVar94 = auVar16._0_4_;
  auVar220 = ZEXT416((uint)fVar94);
  auVar17 = vrsqrtss_avx(auVar220,auVar220);
  fVar72 = auVar17._0_4_;
  fVar72 = fVar72 * 1.5 + fVar94 * -0.5 * fVar72 * fVar72 * fVar72;
  fVar171 = auVar4._0_4_ * fVar72;
  fVar185 = auVar4._4_4_ * fVar72;
  fVar186 = auVar4._8_4_ * fVar72;
  fVar187 = auVar4._12_4_ * fVar72;
  auVar17 = vdpps_avx(auVar4,auVar5,0x7f);
  auVar247._0_4_ = auVar5._0_4_ * fVar94;
  auVar247._4_4_ = auVar5._4_4_ * fVar94;
  auVar247._8_4_ = auVar5._8_4_ * fVar94;
  auVar247._12_4_ = auVar5._12_4_ * fVar94;
  fVar94 = auVar17._0_4_;
  auVar206._0_4_ = auVar4._0_4_ * fVar94;
  auVar206._4_4_ = auVar4._4_4_ * fVar94;
  auVar206._8_4_ = auVar4._8_4_ * fVar94;
  auVar206._12_4_ = auVar4._12_4_ * fVar94;
  auVar4 = vsubps_avx(auVar247,auVar206);
  auVar17 = vrcpss_avx(auVar220,auVar220);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar17,SUB6416(ZEXT464(0x40000000),0));
  fVar97 = auVar17._0_4_ * auVar16._0_4_;
  auVar16 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar119 = auVar16._0_4_;
  auVar220 = ZEXT416((uint)fVar119);
  auVar17 = vrsqrtss_avx(auVar220,auVar220);
  fVar94 = auVar17._0_4_;
  fVar94 = fVar94 * 1.5 + fVar119 * -0.5 * fVar94 * fVar94 * fVar94;
  auVar17 = vdpps_avx(auVar6,auVar7,0x7f);
  fVar264 = fVar94 * auVar6._0_4_;
  fVar276 = fVar94 * auVar6._4_4_;
  fVar277 = fVar94 * auVar6._8_4_;
  fVar278 = fVar94 * auVar6._12_4_;
  auVar189._0_4_ = fVar119 * auVar7._0_4_;
  auVar189._4_4_ = fVar119 * auVar7._4_4_;
  auVar189._8_4_ = fVar119 * auVar7._8_4_;
  auVar189._12_4_ = fVar119 * auVar7._12_4_;
  fVar119 = auVar17._0_4_;
  auVar159._0_4_ = fVar119 * auVar6._0_4_;
  auVar159._4_4_ = fVar119 * auVar6._4_4_;
  auVar159._8_4_ = fVar119 * auVar6._8_4_;
  auVar159._12_4_ = fVar119 * auVar6._12_4_;
  auVar5 = vsubps_avx(auVar189,auVar159);
  auVar17 = vrcpss_avx(auVar220,auVar220);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar17,SUB6416(ZEXT464(0x40000000),0));
  fVar119 = auVar16._0_4_ * auVar17._0_4_;
  auVar16 = vshufps_avx(auVar9,auVar9,0xff);
  auVar221._0_4_ = auVar16._0_4_ * fVar171;
  auVar221._4_4_ = auVar16._4_4_ * fVar185;
  auVar221._8_4_ = auVar16._8_4_ * fVar186;
  auVar221._12_4_ = auVar16._12_4_ * fVar187;
  local_468 = vsubps_avx(auVar9,auVar221);
  auVar17 = vshufps_avx(auVar78,auVar78,0xff);
  auVar248._0_4_ = auVar17._0_4_ * fVar171 + fVar72 * auVar4._0_4_ * fVar97 * auVar16._0_4_;
  auVar248._4_4_ = auVar17._4_4_ * fVar185 + fVar72 * auVar4._4_4_ * fVar97 * auVar16._4_4_;
  auVar248._8_4_ = auVar17._8_4_ * fVar186 + fVar72 * auVar4._8_4_ * fVar97 * auVar16._8_4_;
  auVar248._12_4_ = auVar17._12_4_ * fVar187 + fVar72 * auVar4._12_4_ * fVar97 * auVar16._12_4_;
  auVar4 = vsubps_avx(auVar78,auVar248);
  local_478._0_4_ = auVar221._0_4_ + auVar9._0_4_;
  local_478._4_4_ = auVar221._4_4_ + auVar9._4_4_;
  fStack_470 = auVar221._8_4_ + auVar9._8_4_;
  fStack_46c = auVar221._12_4_ + auVar9._12_4_;
  auVar16 = vshufps_avx(auVar75,auVar75,0xff);
  auVar121._0_4_ = fVar264 * auVar16._0_4_;
  auVar121._4_4_ = fVar276 * auVar16._4_4_;
  auVar121._8_4_ = fVar277 * auVar16._8_4_;
  auVar121._12_4_ = fVar278 * auVar16._12_4_;
  local_488 = vsubps_avx(auVar75,auVar121);
  auVar17 = vshufps_avx(auVar157,auVar157,0xff);
  auVar100._0_4_ = fVar264 * auVar17._0_4_ + auVar16._0_4_ * fVar94 * auVar5._0_4_ * fVar119;
  auVar100._4_4_ = fVar276 * auVar17._4_4_ + auVar16._4_4_ * fVar94 * auVar5._4_4_ * fVar119;
  auVar100._8_4_ = fVar277 * auVar17._8_4_ + auVar16._8_4_ * fVar94 * auVar5._8_4_ * fVar119;
  auVar100._12_4_ = fVar278 * auVar17._12_4_ + auVar16._12_4_ * fVar94 * auVar5._12_4_ * fVar119;
  auVar16 = vsubps_avx(auVar157,auVar100);
  fVar171 = auVar75._0_4_ + auVar121._0_4_;
  fVar185 = auVar75._4_4_ + auVar121._4_4_;
  fVar186 = auVar75._8_4_ + auVar121._8_4_;
  fVar187 = auVar75._12_4_ + auVar121._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar4._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar4._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar4._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar4._12_4_ * 0.33333334;
  auVar101._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar101._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar101._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar101._12_4_ = auVar16._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar101);
  local_448 = vsubps_avx(local_468,auVar8);
  auVar16 = vshufps_avx(local_448,local_448,0x55);
  auVar17 = vshufps_avx(local_448,local_448,0xaa);
  aVar3 = (local_518->vy).field_0;
  fVar72 = (local_518->vz).field_0.m128[0];
  fVar94 = *(float *)((long)&(local_518->vz).field_0 + 4);
  fVar97 = *(float *)((long)&(local_518->vz).field_0 + 8);
  fVar119 = *(float *)((long)&(local_518->vz).field_0 + 0xc);
  auVar102._0_4_ = fVar72 * auVar17._0_4_;
  auVar102._4_4_ = fVar94 * auVar17._4_4_;
  auVar102._8_4_ = fVar97 * auVar17._8_4_;
  auVar102._12_4_ = fVar119 * auVar17._12_4_;
  auVar4 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar3,auVar16);
  local_458 = vsubps_avx(local_498,auVar8);
  auVar16 = vshufps_avx(local_458,local_458,0x55);
  auVar17 = vshufps_avx(local_458,local_458,0xaa);
  auVar286._0_4_ = fVar72 * auVar17._0_4_;
  auVar286._4_4_ = fVar94 * auVar17._4_4_;
  auVar286._8_4_ = fVar97 * auVar17._8_4_;
  auVar286._12_4_ = fVar119 * auVar17._12_4_;
  auVar17 = vfmadd231ps_fma(auVar286,(undefined1  [16])aVar3,auVar16);
  auVar220 = vsubps_avx(local_4a8,auVar8);
  auVar16 = vshufps_avx(auVar220,auVar220,0xaa);
  auVar254._0_4_ = fVar72 * auVar16._0_4_;
  auVar254._4_4_ = fVar94 * auVar16._4_4_;
  auVar254._8_4_ = fVar97 * auVar16._8_4_;
  auVar254._12_4_ = fVar119 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar220,auVar220,0x55);
  auVar5 = vfmadd231ps_fma(auVar254,(undefined1  [16])aVar3,auVar16);
  auVar9 = vsubps_avx(local_488,auVar8);
  auVar16 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar266._0_4_ = fVar72 * auVar16._0_4_;
  auVar266._4_4_ = fVar94 * auVar16._4_4_;
  auVar266._8_4_ = fVar97 * auVar16._8_4_;
  auVar266._12_4_ = fVar119 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar9,auVar9,0x55);
  auVar6 = vfmadd231ps_fma(auVar266,(undefined1  [16])aVar3,auVar16);
  auVar75 = vsubps_avx(_local_478,auVar8);
  auVar16 = vshufps_avx(auVar75,auVar75,0xaa);
  auVar256._0_4_ = fVar72 * auVar16._0_4_;
  auVar256._4_4_ = fVar94 * auVar16._4_4_;
  auVar256._8_4_ = fVar97 * auVar16._8_4_;
  auVar256._12_4_ = fVar119 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar75,auVar75,0x55);
  auVar7 = vfmadd231ps_fma(auVar256,(undefined1  [16])aVar3,auVar16);
  local_4b8._0_4_ = (fVar134 + auVar248._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar95 + auVar248._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar96 + auVar248._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar156 + auVar248._12_4_) * 0.33333334 + fStack_46c;
  auVar157 = vsubps_avx(_local_4b8,auVar8);
  auVar16 = vshufps_avx(auVar157,auVar157,0xaa);
  auVar207._0_4_ = auVar16._0_4_ * fVar72;
  auVar207._4_4_ = auVar16._4_4_ * fVar94;
  auVar207._8_4_ = auVar16._8_4_ * fVar97;
  auVar207._12_4_ = auVar16._12_4_ * fVar119;
  auVar16 = vshufps_avx(auVar157,auVar157,0x55);
  auVar78 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar3,auVar16);
  auVar222._0_4_ = (fVar74 + auVar100._0_4_) * 0.33333334;
  auVar222._4_4_ = (fVar234 + auVar100._4_4_) * 0.33333334;
  auVar222._8_4_ = (fVar146 + auVar100._8_4_) * 0.33333334;
  auVar222._12_4_ = (fVar147 + auVar100._12_4_) * 0.33333334;
  auVar26._4_4_ = fVar185;
  auVar26._0_4_ = fVar171;
  auVar26._8_4_ = fVar186;
  auVar26._12_4_ = fVar187;
  _local_4c8 = vsubps_avx(auVar26,auVar222);
  auVar76 = vsubps_avx(_local_4c8,auVar8);
  auVar16 = vshufps_avx(auVar76,auVar76,0xaa);
  auVar223._0_4_ = auVar16._0_4_ * fVar72;
  auVar223._4_4_ = auVar16._4_4_ * fVar94;
  auVar223._8_4_ = auVar16._8_4_ * fVar97;
  auVar223._12_4_ = auVar16._12_4_ * fVar119;
  auVar16 = vshufps_avx(auVar76,auVar76,0x55);
  auVar100 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar3,auVar16);
  auVar99 = vsubps_avx(auVar26,auVar8);
  auVar16 = vshufps_avx(auVar99,auVar99,0xaa);
  auVar77._0_4_ = fVar72 * auVar16._0_4_;
  auVar77._4_4_ = fVar94 * auVar16._4_4_;
  auVar77._8_4_ = fVar97 * auVar16._8_4_;
  auVar77._12_4_ = fVar119 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar99,auVar99,0x55);
  auVar16 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar16);
  auVar173._4_4_ = local_448._0_4_;
  auVar173._0_4_ = local_448._0_4_;
  auVar173._8_4_ = local_448._0_4_;
  auVar173._12_4_ = local_448._0_4_;
  aVar3 = (local_518->vx).field_0;
  auVar26 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar3,auVar173);
  auVar174._4_4_ = local_458._0_4_;
  auVar174._0_4_ = local_458._0_4_;
  auVar174._8_4_ = local_458._0_4_;
  auVar174._12_4_ = local_458._0_4_;
  auVar77 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar3,auVar174);
  uVar73 = auVar220._0_4_;
  auVar138._4_4_ = uVar73;
  auVar138._0_4_ = uVar73;
  auVar138._8_4_ = uVar73;
  auVar138._12_4_ = uVar73;
  auVar101 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar3,auVar138);
  uVar73 = auVar9._0_4_;
  auVar175._4_4_ = uVar73;
  auVar175._0_4_ = uVar73;
  auVar175._8_4_ = uVar73;
  auVar175._12_4_ = uVar73;
  auVar27 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar3,auVar175);
  uVar73 = auVar75._0_4_;
  auVar176._4_4_ = uVar73;
  auVar176._0_4_ = uVar73;
  auVar176._8_4_ = uVar73;
  auVar176._12_4_ = uVar73;
  auVar102 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar3,auVar176);
  uVar73 = auVar157._0_4_;
  auVar177._4_4_ = uVar73;
  auVar177._0_4_ = uVar73;
  auVar177._8_4_ = uVar73;
  auVar177._12_4_ = uVar73;
  auVar120 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar3,auVar177);
  uVar73 = auVar76._0_4_;
  auVar178._4_4_ = uVar73;
  auVar178._0_4_ = uVar73;
  auVar178._8_4_ = uVar73;
  auVar178._12_4_ = uVar73;
  auVar121 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar3,auVar178);
  uVar73 = auVar99._0_4_;
  auVar179._4_4_ = uVar73;
  auVar179._0_4_ = uVar73;
  auVar179._8_4_ = uVar73;
  auVar179._12_4_ = uVar73;
  auVar135 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar179);
  auVar5 = vmovlhps_avx(auVar26,auVar102);
  auVar6 = vmovlhps_avx(auVar77,auVar120);
  auVar7 = vmovlhps_avx(auVar101,auVar121);
  auVar8 = vmovlhps_avx(auVar27,auVar135);
  auVar16 = vminps_avx(auVar5,auVar6);
  auVar17 = vminps_avx(auVar7,auVar8);
  auVar4 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(auVar5,auVar6);
  auVar17 = vmaxps_avx(auVar7,auVar8);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vshufpd_avx(auVar4,auVar4,3);
  auVar4 = vminps_avx(auVar4,auVar17);
  auVar17 = vshufpd_avx(auVar16,auVar16,3);
  auVar17 = vmaxps_avx(auVar16,auVar17);
  auVar236._8_4_ = 0x7fffffff;
  auVar236._0_8_ = 0x7fffffff7fffffff;
  auVar236._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar236,auVar4);
  auVar17 = vandps_avx(auVar236,auVar17);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vmovshdup_avx(auVar16);
  auVar16 = vmaxss_avx(auVar17,auVar16);
  fVar94 = auVar16._0_4_ * 9.536743e-07;
  auVar190._8_8_ = auVar26._0_8_;
  auVar190._0_8_ = auVar26._0_8_;
  auVar237._8_8_ = auVar77._0_8_;
  auVar237._0_8_ = auVar77._0_8_;
  auVar255._0_8_ = auVar101._0_8_;
  auVar255._8_8_ = auVar255._0_8_;
  auVar267._0_8_ = auVar27._0_8_;
  auVar267._8_8_ = auVar267._0_8_;
  local_78 = fVar94;
  fStack_74 = fVar94;
  fStack_70 = fVar94;
  fStack_6c = fVar94;
  fStack_68 = fVar94;
  fStack_64 = fVar94;
  fStack_60 = fVar94;
  fStack_5c = fVar94;
  fStack_90 = -fVar94;
  local_98 = -fVar94;
  fStack_94 = -fVar94;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar69 = false;
  uVar63 = 0;
  fVar72 = *(float *)(ray + k * 4 + 0x30);
  auVar17 = vsubps_avx(auVar6,auVar5);
  auVar4 = vsubps_avx(auVar7,auVar6);
  auVar100 = vsubps_avx(auVar8,auVar7);
  auVar26 = vsubps_avx(_local_478,local_468);
  auVar77 = vsubps_avx(_local_4b8,local_498);
  auVar101 = vsubps_avx(_local_4c8,local_4a8);
  auVar27._4_4_ = fVar185;
  auVar27._0_4_ = fVar171;
  auVar27._8_4_ = fVar186;
  auVar27._12_4_ = fVar187;
  auVar27 = vsubps_avx(auVar27,local_488);
  auVar78 = ZEXT816(0x3f80000000000000);
  auVar16 = auVar78;
LAB_0135cf17:
  auVar136 = vshufps_avx(auVar78,auVar78,0x50);
  auVar287._8_4_ = 0x3f800000;
  auVar287._0_8_ = 0x3f8000003f800000;
  auVar287._12_4_ = 0x3f800000;
  auVar292._16_4_ = 0x3f800000;
  auVar292._0_16_ = auVar287;
  auVar292._20_4_ = 0x3f800000;
  auVar292._24_4_ = 0x3f800000;
  auVar292._28_4_ = 0x3f800000;
  auVar148 = vsubps_avx(auVar287,auVar136);
  fVar97 = auVar136._0_4_;
  fVar147 = auVar102._0_4_;
  auVar79._0_4_ = fVar147 * fVar97;
  fVar119 = auVar136._4_4_;
  fVar264 = auVar102._4_4_;
  auVar79._4_4_ = fVar264 * fVar119;
  fVar134 = auVar136._8_4_;
  auVar79._8_4_ = fVar147 * fVar134;
  fVar95 = auVar136._12_4_;
  auVar79._12_4_ = fVar264 * fVar95;
  fVar276 = auVar120._0_4_;
  auVar180._0_4_ = fVar276 * fVar97;
  fVar277 = auVar120._4_4_;
  auVar180._4_4_ = fVar277 * fVar119;
  auVar180._8_4_ = fVar276 * fVar134;
  auVar180._12_4_ = fVar277 * fVar95;
  fVar204 = auVar121._0_4_;
  auVar149._0_4_ = fVar204 * fVar97;
  fVar217 = auVar121._4_4_;
  auVar149._4_4_ = fVar217 * fVar119;
  auVar149._8_4_ = fVar204 * fVar134;
  auVar149._12_4_ = fVar217 * fVar95;
  fVar218 = auVar135._0_4_;
  auVar122._0_4_ = fVar218 * fVar97;
  fVar233 = auVar135._4_4_;
  auVar122._4_4_ = fVar233 * fVar119;
  auVar122._8_4_ = fVar218 * fVar134;
  auVar122._12_4_ = fVar233 * fVar95;
  auVar256 = vfmadd231ps_fma(auVar79,auVar148,auVar190);
  auVar162 = vfmadd231ps_fma(auVar180,auVar148,auVar237);
  auVar172 = vfmadd231ps_fma(auVar149,auVar148,auVar255);
  auVar248 = vfmadd231ps_fma(auVar122,auVar267,auVar148);
  auVar136 = vmovshdup_avx(auVar16);
  fVar97 = auVar16._0_4_;
  fStack_140 = (auVar136._0_4_ - fVar97) * 0.04761905;
  auVar231._4_4_ = fVar97;
  auVar231._0_4_ = fVar97;
  auVar231._8_4_ = fVar97;
  auVar231._12_4_ = fVar97;
  auVar231._16_4_ = fVar97;
  auVar231._20_4_ = fVar97;
  auVar231._24_4_ = fVar97;
  auVar231._28_4_ = fVar97;
  auVar115._0_8_ = auVar136._0_8_;
  auVar115._8_8_ = auVar115._0_8_;
  auVar115._16_8_ = auVar115._0_8_;
  auVar115._24_8_ = auVar115._0_8_;
  auVar90 = vsubps_avx(auVar115,auVar231);
  uVar73 = auVar256._0_4_;
  auVar283._4_4_ = uVar73;
  auVar283._0_4_ = uVar73;
  auVar283._8_4_ = uVar73;
  auVar283._12_4_ = uVar73;
  auVar283._16_4_ = uVar73;
  auVar283._20_4_ = uVar73;
  auVar283._24_4_ = uVar73;
  auVar283._28_4_ = uVar73;
  auVar136 = vmovshdup_avx(auVar256);
  uVar98 = auVar136._0_8_;
  auVar275._8_8_ = uVar98;
  auVar275._0_8_ = uVar98;
  auVar275._16_8_ = uVar98;
  auVar275._24_8_ = uVar98;
  fVar146 = auVar162._0_4_;
  auVar261._4_4_ = fVar146;
  auVar261._0_4_ = fVar146;
  auVar261._8_4_ = fVar146;
  auVar261._12_4_ = fVar146;
  auVar261._16_4_ = fVar146;
  auVar261._20_4_ = fVar146;
  auVar261._24_4_ = fVar146;
  auVar261._28_4_ = fVar146;
  auVar148 = vmovshdup_avx(auVar162);
  auVar116._0_8_ = auVar148._0_8_;
  auVar116._8_8_ = auVar116._0_8_;
  auVar116._16_8_ = auVar116._0_8_;
  auVar116._24_8_ = auVar116._0_8_;
  fVar234 = auVar172._0_4_;
  auVar195._4_4_ = fVar234;
  auVar195._0_4_ = fVar234;
  auVar195._8_4_ = fVar234;
  auVar195._12_4_ = fVar234;
  auVar195._16_4_ = fVar234;
  auVar195._20_4_ = fVar234;
  auVar195._24_4_ = fVar234;
  auVar195._28_4_ = fVar234;
  auVar158 = vmovshdup_avx(auVar172);
  auVar215._0_8_ = auVar158._0_8_;
  auVar215._8_8_ = auVar215._0_8_;
  auVar215._16_8_ = auVar215._0_8_;
  auVar215._24_8_ = auVar215._0_8_;
  fVar74 = auVar248._0_4_;
  auVar159 = vmovshdup_avx(auVar248);
  auVar173 = vfmadd132ps_fma(auVar90,auVar231,_DAT_01f7b040);
  auVar90 = vsubps_avx(auVar292,ZEXT1632(auVar173));
  fVar97 = auVar173._0_4_;
  fVar119 = auVar173._4_4_;
  auVar18._4_4_ = fVar146 * fVar119;
  auVar18._0_4_ = fVar146 * fVar97;
  fVar134 = auVar173._8_4_;
  auVar18._8_4_ = fVar146 * fVar134;
  fVar95 = auVar173._12_4_;
  auVar18._12_4_ = fVar146 * fVar95;
  auVar18._16_4_ = fVar146 * 0.0;
  auVar18._20_4_ = fVar146 * 0.0;
  auVar18._24_4_ = fVar146 * 0.0;
  auVar18._28_4_ = 0x3f800000;
  auVar173 = vfmadd231ps_fma(auVar18,auVar90,auVar283);
  fVar96 = auVar148._0_4_;
  fVar156 = auVar148._4_4_;
  auVar30._4_4_ = fVar156 * fVar119;
  auVar30._0_4_ = fVar96 * fVar97;
  auVar30._8_4_ = fVar96 * fVar134;
  auVar30._12_4_ = fVar156 * fVar95;
  auVar30._16_4_ = fVar96 * 0.0;
  auVar30._20_4_ = fVar156 * 0.0;
  auVar30._24_4_ = fVar96 * 0.0;
  auVar30._28_4_ = uVar73;
  auVar174 = vfmadd231ps_fma(auVar30,auVar90,auVar275);
  auVar31._4_4_ = fVar234 * fVar119;
  auVar31._0_4_ = fVar234 * fVar97;
  auVar31._8_4_ = fVar234 * fVar134;
  auVar31._12_4_ = fVar234 * fVar95;
  auVar31._16_4_ = fVar234 * 0.0;
  auVar31._20_4_ = fVar234 * 0.0;
  auVar31._24_4_ = fVar234 * 0.0;
  auVar31._28_4_ = auVar136._4_4_;
  auVar138 = vfmadd231ps_fma(auVar31,auVar90,auVar261);
  fVar96 = auVar158._0_4_;
  fVar156 = auVar158._4_4_;
  auVar32._4_4_ = fVar156 * fVar119;
  auVar32._0_4_ = fVar96 * fVar97;
  auVar32._8_4_ = fVar96 * fVar134;
  auVar32._12_4_ = fVar156 * fVar95;
  auVar32._16_4_ = fVar96 * 0.0;
  auVar32._20_4_ = fVar156 * 0.0;
  auVar32._24_4_ = fVar96 * 0.0;
  auVar32._28_4_ = fVar146;
  auVar175 = vfmadd231ps_fma(auVar32,auVar90,auVar116);
  auVar136 = vshufps_avx(auVar256,auVar256,0xaa);
  local_578._8_8_ = auVar136._0_8_;
  local_578._0_8_ = local_578._8_8_;
  local_578._16_8_ = local_578._8_8_;
  local_578._24_8_ = local_578._8_8_;
  auVar148 = vshufps_avx(auVar256,auVar256,0xff);
  uStack_620 = auVar148._0_8_;
  local_628 = (undefined1  [8])uStack_620;
  uStack_618 = uStack_620;
  uStack_610 = uStack_620;
  auVar33._4_4_ = fVar74 * fVar119;
  auVar33._0_4_ = fVar74 * fVar97;
  auVar33._8_4_ = fVar74 * fVar134;
  auVar33._12_4_ = fVar74 * fVar95;
  auVar33._16_4_ = fVar74 * 0.0;
  auVar33._20_4_ = fVar74 * 0.0;
  auVar33._24_4_ = fVar74 * 0.0;
  auVar33._28_4_ = fVar74;
  auVar256 = vfmadd231ps_fma(auVar33,auVar90,auVar195);
  auVar148 = vshufps_avx(auVar162,auVar162,0xaa);
  auVar196._0_8_ = auVar148._0_8_;
  auVar196._8_8_ = auVar196._0_8_;
  auVar196._16_8_ = auVar196._0_8_;
  auVar196._24_8_ = auVar196._0_8_;
  auVar158 = vshufps_avx(auVar162,auVar162,0xff);
  local_4e8._8_8_ = auVar158._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar96 = auVar159._0_4_;
  fVar156 = auVar159._4_4_;
  auVar34._4_4_ = fVar156 * fVar119;
  auVar34._0_4_ = fVar96 * fVar97;
  auVar34._8_4_ = fVar96 * fVar134;
  auVar34._12_4_ = fVar156 * fVar95;
  auVar34._16_4_ = fVar96 * 0.0;
  auVar34._20_4_ = fVar156 * 0.0;
  auVar34._24_4_ = fVar96 * 0.0;
  auVar34._28_4_ = auVar136._4_4_;
  auVar176 = vfmadd231ps_fma(auVar34,auVar90,auVar215);
  auVar35._28_4_ = fVar156;
  auVar35._0_28_ =
       ZEXT1628(CONCAT412(auVar138._12_4_ * fVar95,
                          CONCAT48(auVar138._8_4_ * fVar134,
                                   CONCAT44(auVar138._4_4_ * fVar119,auVar138._0_4_ * fVar97))));
  auVar173 = vfmadd231ps_fma(auVar35,auVar90,ZEXT1632(auVar173));
  fVar96 = auVar158._4_4_;
  auVar36._28_4_ = fVar96;
  auVar36._0_28_ =
       ZEXT1628(CONCAT412(auVar175._12_4_ * fVar95,
                          CONCAT48(auVar175._8_4_ * fVar134,
                                   CONCAT44(auVar175._4_4_ * fVar119,auVar175._0_4_ * fVar97))));
  auVar174 = vfmadd231ps_fma(auVar36,auVar90,ZEXT1632(auVar174));
  auVar136 = vshufps_avx(auVar172,auVar172,0xaa);
  uVar98 = auVar136._0_8_;
  auVar184._8_8_ = uVar98;
  auVar184._0_8_ = uVar98;
  auVar184._16_8_ = uVar98;
  auVar184._24_8_ = uVar98;
  auVar159 = vshufps_avx(auVar172,auVar172,0xff);
  uVar98 = auVar159._0_8_;
  auVar293._8_8_ = uVar98;
  auVar293._0_8_ = uVar98;
  auVar293._16_8_ = uVar98;
  auVar293._24_8_ = uVar98;
  auVar172 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar256._12_4_ * fVar95,
                                                CONCAT48(auVar256._8_4_ * fVar134,
                                                         CONCAT44(auVar256._4_4_ * fVar119,
                                                                  auVar256._0_4_ * fVar97)))),
                             auVar90,ZEXT1632(auVar138));
  auVar256 = vshufps_avx(auVar248,auVar248,0xaa);
  auVar162 = vshufps_avx(auVar248,auVar248,0xff);
  auVar248 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar176._12_4_,
                                                CONCAT48(fVar134 * auVar176._8_4_,
                                                         CONCAT44(fVar119 * auVar176._4_4_,
                                                                  fVar97 * auVar176._0_4_)))),
                             auVar90,ZEXT1632(auVar175));
  auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar172._12_4_,
                                                CONCAT48(fVar134 * auVar172._8_4_,
                                                         CONCAT44(fVar119 * auVar172._4_4_,
                                                                  fVar97 * auVar172._0_4_)))),
                             auVar90,ZEXT1632(auVar173));
  auVar18 = vsubps_avx(ZEXT1632(auVar172),ZEXT1632(auVar173));
  auVar172 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar248._12_4_,
                                                CONCAT48(fVar134 * auVar248._8_4_,
                                                         CONCAT44(fVar119 * auVar248._4_4_,
                                                                  fVar97 * auVar248._0_4_)))),
                             auVar90,ZEXT1632(auVar174));
  auVar19 = vsubps_avx(ZEXT1632(auVar248),ZEXT1632(auVar174));
  fVar156 = auVar19._28_4_;
  auVar262._0_4_ = fStack_140 * auVar18._0_4_ * 3.0;
  auVar262._4_4_ = fStack_140 * auVar18._4_4_ * 3.0;
  auVar262._8_4_ = fStack_140 * auVar18._8_4_ * 3.0;
  auVar262._12_4_ = fStack_140 * auVar18._12_4_ * 3.0;
  auVar262._16_4_ = fStack_140 * auVar18._16_4_ * 3.0;
  auVar262._20_4_ = fStack_140 * auVar18._20_4_ * 3.0;
  auVar262._24_4_ = fStack_140 * auVar18._24_4_ * 3.0;
  auVar262._28_4_ = 0;
  local_438._0_4_ = fStack_140 * auVar19._0_4_ * 3.0;
  local_438._4_4_ = fStack_140 * auVar19._4_4_ * 3.0;
  fStack_430 = fStack_140 * auVar19._8_4_ * 3.0;
  fStack_42c = fStack_140 * auVar19._12_4_ * 3.0;
  fStack_428 = fStack_140 * auVar19._16_4_ * 3.0;
  fStack_424 = fStack_140 * auVar19._20_4_ * 3.0;
  fStack_420 = fStack_140 * auVar19._24_4_ * 3.0;
  fStack_41c = fVar156;
  fVar74 = auVar148._0_4_;
  fVar234 = auVar148._4_4_;
  auVar37._4_4_ = fVar234 * fVar119;
  auVar37._0_4_ = fVar74 * fVar97;
  auVar37._8_4_ = fVar74 * fVar134;
  auVar37._12_4_ = fVar234 * fVar95;
  auVar37._16_4_ = fVar74 * 0.0;
  auVar37._20_4_ = fVar234 * 0.0;
  auVar37._24_4_ = fVar74 * 0.0;
  auVar37._28_4_ = fVar156;
  auVar148 = vfmadd231ps_fma(auVar37,auVar90,local_578);
  fVar74 = auVar158._0_4_;
  auVar38._4_4_ = fVar96 * fVar119;
  auVar38._0_4_ = fVar74 * fVar97;
  auVar38._8_4_ = fVar74 * fVar134;
  auVar38._12_4_ = fVar96 * fVar95;
  auVar38._16_4_ = fVar74 * 0.0;
  auVar38._20_4_ = fVar96 * 0.0;
  auVar38._24_4_ = fVar74 * 0.0;
  auVar38._28_4_ = 0;
  auVar158 = vfmadd231ps_fma(auVar38,auVar90,_local_628);
  fVar96 = auVar136._0_4_;
  fVar74 = auVar136._4_4_;
  auVar39._4_4_ = fVar74 * fVar119;
  auVar39._0_4_ = fVar96 * fVar97;
  auVar39._8_4_ = fVar96 * fVar134;
  auVar39._12_4_ = fVar74 * fVar95;
  auVar39._16_4_ = fVar96 * 0.0;
  auVar39._20_4_ = fVar74 * 0.0;
  auVar39._24_4_ = fVar96 * 0.0;
  auVar39._28_4_ = auVar18._28_4_;
  auVar136 = vfmadd231ps_fma(auVar39,auVar90,auVar196);
  fVar96 = auVar159._0_4_;
  fVar146 = auVar159._4_4_;
  auVar40._4_4_ = fVar146 * fVar119;
  auVar40._0_4_ = fVar96 * fVar97;
  auVar40._8_4_ = fVar96 * fVar134;
  auVar40._12_4_ = fVar146 * fVar95;
  auVar40._16_4_ = fVar96 * 0.0;
  auVar40._20_4_ = fVar146 * 0.0;
  auVar40._24_4_ = fVar96 * 0.0;
  auVar40._28_4_ = fVar234;
  auVar159 = vfmadd231ps_fma(auVar40,auVar90,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar138));
  fVar96 = auVar256._0_4_;
  fVar74 = auVar256._4_4_;
  auVar41._4_4_ = fVar74 * fVar119;
  auVar41._0_4_ = fVar96 * fVar97;
  auVar41._8_4_ = fVar96 * fVar134;
  auVar41._12_4_ = fVar74 * fVar95;
  auVar41._16_4_ = fVar96 * 0.0;
  auVar41._20_4_ = fVar74 * 0.0;
  auVar41._24_4_ = fVar96 * 0.0;
  auVar41._28_4_ = fVar74;
  auVar256 = vfmadd231ps_fma(auVar41,auVar90,auVar184);
  auVar22 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar172));
  fVar96 = auVar162._0_4_;
  fVar74 = auVar162._4_4_;
  auVar42._4_4_ = fVar74 * fVar119;
  auVar42._0_4_ = fVar96 * fVar97;
  auVar42._8_4_ = fVar96 * fVar134;
  auVar42._12_4_ = fVar74 * fVar95;
  auVar42._16_4_ = fVar96 * 0.0;
  auVar42._20_4_ = fVar74 * 0.0;
  auVar42._24_4_ = fVar96 * 0.0;
  auVar42._28_4_ = fVar74;
  auVar162 = vfmadd231ps_fma(auVar42,auVar90,auVar293);
  auVar43._28_4_ = fVar146;
  auVar43._0_28_ =
       ZEXT1628(CONCAT412(auVar136._12_4_ * fVar95,
                          CONCAT48(auVar136._8_4_ * fVar134,
                                   CONCAT44(auVar136._4_4_ * fVar119,auVar136._0_4_ * fVar97))));
  auVar148 = vfmadd231ps_fma(auVar43,auVar90,ZEXT1632(auVar148));
  auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar159._12_4_,
                                                CONCAT48(fVar134 * auVar159._8_4_,
                                                         CONCAT44(fVar119 * auVar159._4_4_,
                                                                  fVar97 * auVar159._0_4_)))),
                             auVar90,ZEXT1632(auVar158));
  auVar117._0_4_ = auVar138._0_4_ + auVar262._0_4_;
  auVar117._4_4_ = auVar138._4_4_ + auVar262._4_4_;
  auVar117._8_4_ = auVar138._8_4_ + auVar262._8_4_;
  auVar117._12_4_ = auVar138._12_4_ + auVar262._12_4_;
  auVar117._16_4_ = auVar262._16_4_ + 0.0;
  auVar117._20_4_ = auVar262._20_4_ + 0.0;
  auVar117._24_4_ = auVar262._24_4_ + 0.0;
  auVar117._28_4_ = 0;
  auVar136 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar256._12_4_ * fVar95,
                                                CONCAT48(auVar256._8_4_ * fVar134,
                                                         CONCAT44(auVar256._4_4_ * fVar119,
                                                                  auVar256._0_4_ * fVar97)))),
                             auVar90,ZEXT1632(auVar136));
  auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar162._12_4_ * fVar95,
                                                CONCAT48(auVar162._8_4_ * fVar134,
                                                         CONCAT44(auVar162._4_4_ * fVar119,
                                                                  auVar162._0_4_ * fVar97)))),
                             auVar90,ZEXT1632(auVar159));
  auVar256 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar136._12_4_,
                                                CONCAT48(fVar134 * auVar136._8_4_,
                                                         CONCAT44(fVar119 * auVar136._4_4_,
                                                                  fVar97 * auVar136._0_4_)))),
                             auVar90,ZEXT1632(auVar148));
  auVar162 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar159._12_4_ * fVar95,
                                                CONCAT48(auVar159._8_4_ * fVar134,
                                                         CONCAT44(auVar159._4_4_ * fVar119,
                                                                  auVar159._0_4_ * fVar97)))),
                             ZEXT1632(auVar158),auVar90);
  auVar90 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar148));
  auVar18 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar158));
  auVar284._0_4_ = fStack_140 * auVar90._0_4_ * 3.0;
  auVar284._4_4_ = fStack_140 * auVar90._4_4_ * 3.0;
  auVar284._8_4_ = fStack_140 * auVar90._8_4_ * 3.0;
  auVar284._12_4_ = fStack_140 * auVar90._12_4_ * 3.0;
  auVar284._16_4_ = fStack_140 * auVar90._16_4_ * 3.0;
  auVar284._20_4_ = fStack_140 * auVar90._20_4_ * 3.0;
  auVar284._24_4_ = fStack_140 * auVar90._24_4_ * 3.0;
  auVar284._28_4_ = 0;
  local_158 = fStack_140 * auVar18._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar18._4_4_ * 3.0;
  auVar44._4_4_ = fStack_154;
  auVar44._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar18._8_4_ * 3.0;
  auVar44._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar18._12_4_ * 3.0;
  auVar44._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar18._16_4_ * 3.0;
  auVar44._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar18._20_4_ * 3.0;
  auVar44._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar18._24_4_ * 3.0;
  auVar44._24_4_ = fStack_140;
  auVar44._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar256));
  auVar23 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar162));
  auVar90 = vsubps_avx(ZEXT1632(auVar256),ZEXT1632(auVar138));
  auVar18 = vsubps_avx(ZEXT1632(auVar162),ZEXT1632(auVar172));
  auVar19 = vsubps_avx(_local_508,local_4e8);
  fVar278 = auVar90._0_4_ + auVar19._0_4_;
  fVar198 = auVar90._4_4_ + auVar19._4_4_;
  fVar199 = auVar90._8_4_ + auVar19._8_4_;
  fVar200 = auVar90._12_4_ + auVar19._12_4_;
  fVar201 = auVar90._16_4_ + auVar19._16_4_;
  fVar202 = auVar90._20_4_ + auVar19._20_4_;
  fVar203 = auVar90._24_4_ + auVar19._24_4_;
  auVar20 = vsubps_avx(auVar23,auVar22);
  auVar91._0_4_ = auVar18._0_4_ + auVar20._0_4_;
  auVar91._4_4_ = auVar18._4_4_ + auVar20._4_4_;
  auVar91._8_4_ = auVar18._8_4_ + auVar20._8_4_;
  auVar91._12_4_ = auVar18._12_4_ + auVar20._12_4_;
  auVar91._16_4_ = auVar18._16_4_ + auVar20._16_4_;
  auVar91._20_4_ = auVar18._20_4_ + auVar20._20_4_;
  auVar91._24_4_ = auVar18._24_4_ + auVar20._24_4_;
  auVar91._28_4_ = auVar18._28_4_ + auVar20._28_4_;
  local_f8 = ZEXT1632(auVar172);
  fVar97 = auVar172._0_4_;
  local_178 = (float)local_438._0_4_ + fVar97;
  fVar119 = auVar172._4_4_;
  fStack_174 = (float)local_438._4_4_ + fVar119;
  fVar134 = auVar172._8_4_;
  fStack_170 = fStack_430 + fVar134;
  fVar95 = auVar172._12_4_;
  fStack_16c = fStack_42c + fVar95;
  fStack_168 = fStack_428 + 0.0;
  fStack_164 = fStack_424 + 0.0;
  fStack_160 = fStack_420 + 0.0;
  local_b8 = ZEXT1632(auVar138);
  auVar18 = vsubps_avx(local_b8,auVar262);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar18);
  auVar18 = vsubps_avx(local_f8,_local_438);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar18);
  local_118._0_4_ = auVar256._0_4_ + auVar284._0_4_;
  local_118._4_4_ = auVar256._4_4_ + auVar284._4_4_;
  local_118._8_4_ = auVar256._8_4_ + auVar284._8_4_;
  local_118._12_4_ = auVar256._12_4_ + auVar284._12_4_;
  local_118._16_4_ = auVar284._16_4_ + 0.0;
  local_118._20_4_ = auVar284._20_4_ + 0.0;
  local_118._24_4_ = auVar284._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar263 = ZEXT1632(auVar256);
  auVar18 = vsubps_avx(auVar263,auVar284);
  _local_438 = vpermps_avx2(_DAT_01fb7720,auVar18);
  fVar96 = auVar162._0_4_;
  local_158 = fVar96 + local_158;
  fVar74 = auVar162._4_4_;
  fStack_154 = fVar74 + fStack_154;
  fVar234 = auVar162._8_4_;
  fStack_150 = fVar234 + fStack_150;
  fVar146 = auVar162._12_4_;
  fStack_14c = fVar146 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar18 = vsubps_avx(ZEXT1632(auVar162),auVar44);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar18);
  auVar45._4_4_ = fVar119 * fVar198;
  auVar45._0_4_ = fVar97 * fVar278;
  auVar45._8_4_ = fVar134 * fVar199;
  auVar45._12_4_ = fVar95 * fVar200;
  auVar45._16_4_ = fVar201 * 0.0;
  auVar45._20_4_ = fVar202 * 0.0;
  auVar45._24_4_ = fVar203 * 0.0;
  auVar45._28_4_ = auVar18._28_4_;
  auVar136 = vfnmadd231ps_fma(auVar45,local_b8,auVar91);
  fStack_15c = fVar156 + 0.0;
  auVar46._4_4_ = fStack_174 * fVar198;
  auVar46._0_4_ = local_178 * fVar278;
  auVar46._8_4_ = fStack_170 * fVar199;
  auVar46._12_4_ = fStack_16c * fVar200;
  auVar46._16_4_ = fStack_168 * fVar201;
  auVar46._20_4_ = fStack_164 * fVar202;
  auVar46._24_4_ = fStack_160 * fVar203;
  auVar46._28_4_ = 0;
  auVar148 = vfnmadd231ps_fma(auVar46,auVar91,auVar117);
  auVar47._4_4_ = local_198._4_4_ * fVar198;
  auVar47._0_4_ = local_198._0_4_ * fVar278;
  auVar47._8_4_ = local_198._8_4_ * fVar199;
  auVar47._12_4_ = local_198._12_4_ * fVar200;
  auVar47._16_4_ = local_198._16_4_ * fVar201;
  auVar47._20_4_ = local_198._20_4_ * fVar202;
  auVar47._24_4_ = local_198._24_4_ * fVar203;
  auVar47._28_4_ = fVar156 + 0.0;
  auVar158 = vfnmadd231ps_fma(auVar47,local_d8,auVar91);
  local_628._0_4_ = auVar22._0_4_;
  local_628._4_4_ = auVar22._4_4_;
  uStack_620._0_4_ = auVar22._8_4_;
  uStack_620._4_4_ = auVar22._12_4_;
  uStack_618._0_4_ = auVar22._16_4_;
  uStack_618._4_4_ = auVar22._20_4_;
  uStack_610._0_4_ = auVar22._24_4_;
  uStack_610._4_4_ = auVar22._28_4_;
  auVar48._4_4_ = (float)local_628._4_4_ * fVar198;
  auVar48._0_4_ = (float)local_628._0_4_ * fVar278;
  auVar48._8_4_ = (float)uStack_620 * fVar199;
  auVar48._12_4_ = uStack_620._4_4_ * fVar200;
  auVar48._16_4_ = (float)uStack_618 * fVar201;
  auVar48._20_4_ = uStack_618._4_4_ * fVar202;
  auVar48._24_4_ = (float)uStack_610 * fVar203;
  auVar48._28_4_ = uStack_610._4_4_;
  auVar159 = vfnmadd231ps_fma(auVar48,local_4e8,auVar91);
  auVar216._0_4_ = fVar96 * fVar278;
  auVar216._4_4_ = fVar74 * fVar198;
  auVar216._8_4_ = fVar234 * fVar199;
  auVar216._12_4_ = fVar146 * fVar200;
  auVar216._16_4_ = fVar201 * 0.0;
  auVar216._20_4_ = fVar202 * 0.0;
  auVar216._24_4_ = fVar203 * 0.0;
  auVar216._28_4_ = 0;
  auVar256 = vfnmadd231ps_fma(auVar216,auVar263,auVar91);
  uStack_13c = 0x40400000;
  auVar49._4_4_ = fStack_154 * fVar198;
  auVar49._0_4_ = local_158 * fVar278;
  auVar49._8_4_ = fStack_150 * fVar199;
  auVar49._12_4_ = fStack_14c * fVar200;
  auVar49._16_4_ = fStack_148 * fVar201;
  auVar49._20_4_ = fStack_144 * fVar202;
  auVar49._24_4_ = fStack_140 * fVar203;
  auVar49._28_4_ = local_4e8._28_4_;
  auVar172 = vfnmadd231ps_fma(auVar49,local_118,auVar91);
  auVar50._4_4_ = local_138._4_4_ * fVar198;
  auVar50._0_4_ = local_138._0_4_ * fVar278;
  auVar50._8_4_ = local_138._8_4_ * fVar199;
  auVar50._12_4_ = local_138._12_4_ * fVar200;
  auVar50._16_4_ = local_138._16_4_ * fVar201;
  auVar50._20_4_ = local_138._20_4_ * fVar202;
  auVar50._24_4_ = local_138._24_4_ * fVar203;
  auVar50._28_4_ = local_138._28_4_;
  auVar248 = vfnmadd231ps_fma(auVar50,_local_438,auVar91);
  auVar51._4_4_ = auVar23._4_4_ * fVar198;
  auVar51._0_4_ = auVar23._0_4_ * fVar278;
  auVar51._8_4_ = auVar23._8_4_ * fVar199;
  auVar51._12_4_ = auVar23._12_4_ * fVar200;
  auVar51._16_4_ = auVar23._16_4_ * fVar201;
  auVar51._20_4_ = auVar23._20_4_ * fVar202;
  auVar51._24_4_ = auVar23._24_4_ * fVar203;
  auVar51._28_4_ = auVar90._28_4_ + auVar19._28_4_;
  auVar232 = ZEXT3264(_local_508);
  auVar173 = vfnmadd231ps_fma(auVar51,_local_508,auVar91);
  auVar18 = vminps_avx(ZEXT1632(auVar136),ZEXT1632(auVar148));
  auVar90 = vmaxps_avx(ZEXT1632(auVar136),ZEXT1632(auVar148));
  auVar19 = vminps_avx(ZEXT1632(auVar158),ZEXT1632(auVar159));
  auVar19 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(ZEXT1632(auVar158),ZEXT1632(auVar159));
  auVar90 = vmaxps_avx(auVar90,auVar18);
  auVar20 = vminps_avx(ZEXT1632(auVar256),ZEXT1632(auVar172));
  auVar18 = vmaxps_avx(ZEXT1632(auVar256),ZEXT1632(auVar172));
  auVar21 = vminps_avx(ZEXT1632(auVar248),ZEXT1632(auVar173));
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar20 = vminps_avx(auVar19,auVar20);
  auVar19 = vmaxps_avx(ZEXT1632(auVar248),ZEXT1632(auVar173));
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(auVar90,auVar18);
  auVar60._4_4_ = fStack_74;
  auVar60._0_4_ = local_78;
  auVar60._8_4_ = fStack_70;
  auVar60._12_4_ = fStack_6c;
  auVar60._16_4_ = fStack_68;
  auVar60._20_4_ = fStack_64;
  auVar60._24_4_ = fStack_60;
  auVar60._28_4_ = fStack_5c;
  auVar90 = vcmpps_avx(auVar20,auVar60,2);
  auVar59._4_4_ = fStack_94;
  auVar59._0_4_ = local_98;
  auVar59._8_4_ = fStack_90;
  auVar59._12_4_ = fStack_8c;
  auVar59._16_4_ = fStack_88;
  auVar59._20_4_ = fStack_84;
  auVar59._24_4_ = fStack_80;
  auVar59._28_4_ = fStack_7c;
  auVar18 = vcmpps_avx(auVar18,auVar59,5);
  auVar90 = vandps_avx(auVar18,auVar90);
  auVar18 = local_1b8 & auVar90;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0x7f,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar18 >> 0xbf,0) != '\0') ||
      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0') {
    auVar18 = vsubps_avx(local_4e8,local_b8);
    auVar19 = vsubps_avx(_local_508,auVar263);
    fVar278 = auVar18._0_4_ + auVar19._0_4_;
    fVar198 = auVar18._4_4_ + auVar19._4_4_;
    fVar199 = auVar18._8_4_ + auVar19._8_4_;
    fVar200 = auVar18._12_4_ + auVar19._12_4_;
    fVar201 = auVar18._16_4_ + auVar19._16_4_;
    fVar202 = auVar18._20_4_ + auVar19._20_4_;
    fVar203 = auVar18._24_4_ + auVar19._24_4_;
    auVar20 = vsubps_avx(auVar22,local_f8);
    auVar21 = vsubps_avx(auVar23,ZEXT1632(auVar162));
    auVar118._0_4_ = auVar20._0_4_ + auVar21._0_4_;
    auVar118._4_4_ = auVar20._4_4_ + auVar21._4_4_;
    auVar118._8_4_ = auVar20._8_4_ + auVar21._8_4_;
    auVar118._12_4_ = auVar20._12_4_ + auVar21._12_4_;
    auVar118._16_4_ = auVar20._16_4_ + auVar21._16_4_;
    auVar118._20_4_ = auVar20._20_4_ + auVar21._20_4_;
    auVar118._24_4_ = auVar20._24_4_ + auVar21._24_4_;
    fVar156 = auVar21._28_4_;
    auVar118._28_4_ = auVar20._28_4_ + fVar156;
    auVar52._4_4_ = fVar119 * fVar198;
    auVar52._0_4_ = fVar97 * fVar278;
    auVar52._8_4_ = fVar134 * fVar199;
    auVar52._12_4_ = fVar95 * fVar200;
    auVar52._16_4_ = fVar201 * 0.0;
    auVar52._20_4_ = fVar202 * 0.0;
    auVar52._24_4_ = fVar203 * 0.0;
    auVar52._28_4_ = auVar23._28_4_;
    auVar256 = vfnmadd231ps_fma(auVar52,auVar118,local_b8);
    auVar53._4_4_ = fVar198 * fStack_174;
    auVar53._0_4_ = fVar278 * local_178;
    auVar53._8_4_ = fVar199 * fStack_170;
    auVar53._12_4_ = fVar200 * fStack_16c;
    auVar53._16_4_ = fVar201 * fStack_168;
    auVar53._20_4_ = fVar202 * fStack_164;
    auVar53._24_4_ = fVar203 * fStack_160;
    auVar53._28_4_ = 0;
    auVar136 = vfnmadd213ps_fma(auVar117,auVar118,auVar53);
    auVar54._4_4_ = fVar198 * local_198._4_4_;
    auVar54._0_4_ = fVar278 * local_198._0_4_;
    auVar54._8_4_ = fVar199 * local_198._8_4_;
    auVar54._12_4_ = fVar200 * local_198._12_4_;
    auVar54._16_4_ = fVar201 * local_198._16_4_;
    auVar54._20_4_ = fVar202 * local_198._20_4_;
    auVar54._24_4_ = fVar203 * local_198._24_4_;
    auVar54._28_4_ = 0;
    auVar148 = vfnmadd213ps_fma(local_d8,auVar118,auVar54);
    auVar55._4_4_ = (float)local_628._4_4_ * fVar198;
    auVar55._0_4_ = (float)local_628._0_4_ * fVar278;
    auVar55._8_4_ = (float)uStack_620 * fVar199;
    auVar55._12_4_ = uStack_620._4_4_ * fVar200;
    auVar55._16_4_ = (float)uStack_618 * fVar201;
    auVar55._20_4_ = uStack_618._4_4_ * fVar202;
    auVar55._24_4_ = (float)uStack_610 * fVar203;
    auVar55._28_4_ = 0;
    auVar162 = vfnmadd231ps_fma(auVar55,auVar118,local_4e8);
    auVar144._0_4_ = fVar96 * fVar278;
    auVar144._4_4_ = fVar74 * fVar198;
    auVar144._8_4_ = fVar234 * fVar199;
    auVar144._12_4_ = fVar146 * fVar200;
    auVar144._16_4_ = fVar201 * 0.0;
    auVar144._20_4_ = fVar202 * 0.0;
    auVar144._24_4_ = fVar203 * 0.0;
    auVar144._28_4_ = 0;
    auVar172 = vfnmadd231ps_fma(auVar144,auVar118,auVar263);
    auVar56._4_4_ = fVar198 * fStack_154;
    auVar56._0_4_ = fVar278 * local_158;
    auVar56._8_4_ = fVar199 * fStack_150;
    auVar56._12_4_ = fVar200 * fStack_14c;
    auVar56._16_4_ = fVar201 * fStack_148;
    auVar56._20_4_ = fVar202 * fStack_144;
    auVar56._24_4_ = fVar203 * fStack_140;
    auVar56._28_4_ = fVar156;
    auVar158 = vfnmadd213ps_fma(local_118,auVar118,auVar56);
    auVar57._4_4_ = fVar198 * local_138._4_4_;
    auVar57._0_4_ = fVar278 * local_138._0_4_;
    auVar57._8_4_ = fVar199 * local_138._8_4_;
    auVar57._12_4_ = fVar200 * local_138._12_4_;
    auVar57._16_4_ = fVar201 * local_138._16_4_;
    auVar57._20_4_ = fVar202 * local_138._20_4_;
    auVar57._24_4_ = fVar203 * local_138._24_4_;
    auVar57._28_4_ = fVar156;
    auVar159 = vfnmadd213ps_fma(_local_438,auVar118,auVar57);
    auVar232 = ZEXT1664(auVar159);
    auVar58._4_4_ = fVar198 * auVar23._4_4_;
    auVar58._0_4_ = fVar278 * auVar23._0_4_;
    auVar58._8_4_ = fVar199 * auVar23._8_4_;
    auVar58._12_4_ = fVar200 * auVar23._12_4_;
    auVar58._16_4_ = fVar201 * auVar23._16_4_;
    auVar58._20_4_ = fVar202 * auVar23._20_4_;
    auVar58._24_4_ = fVar203 * auVar23._24_4_;
    auVar58._28_4_ = auVar18._28_4_ + auVar19._28_4_;
    auVar248 = vfnmadd231ps_fma(auVar58,auVar118,_local_508);
    auVar19 = vminps_avx(ZEXT1632(auVar256),ZEXT1632(auVar136));
    auVar18 = vmaxps_avx(ZEXT1632(auVar256),ZEXT1632(auVar136));
    auVar20 = vminps_avx(ZEXT1632(auVar148),ZEXT1632(auVar162));
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(ZEXT1632(auVar148),ZEXT1632(auVar162));
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar21 = vminps_avx(ZEXT1632(auVar172),ZEXT1632(auVar158));
    auVar19 = vmaxps_avx(ZEXT1632(auVar172),ZEXT1632(auVar158));
    auVar22 = vminps_avx(ZEXT1632(auVar159),ZEXT1632(auVar248));
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(ZEXT1632(auVar159),ZEXT1632(auVar248));
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vcmpps_avx(auVar21,auVar60,2);
    auVar19 = vcmpps_avx(auVar19,auVar59,5);
    auVar18 = vandps_avx(auVar19,auVar18);
    auVar90 = vandps_avx(auVar90,local_1b8);
    auVar19 = auVar90 & auVar18;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar90 = vandps_avx(auVar18,auVar90);
      uVar66 = vmovmskps_avx(auVar90);
      if (uVar66 != 0) {
        mask_stack[uVar63] = uVar66 & 0xff;
        BVar2 = (BBox1f)vmovlps_avx(auVar16);
        cu_stack[uVar63] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar78);
        cv_stack[uVar63] = BVar2;
        uVar63 = (ulong)((int)uVar63 + 1);
      }
    }
  }
LAB_0135d4ca:
  if ((int)uVar63 != 0) {
    uVar62 = (int)uVar63 - 1;
    uVar66 = mask_stack[uVar62];
    fVar97 = cu_stack[uVar62].lower;
    fVar119 = cu_stack[uVar62].upper;
    iVar25 = 0;
    for (uVar68 = (ulong)uVar66; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      iVar25 = iVar25 + 1;
    }
    uVar66 = uVar66 - 1 & uVar66;
    if (uVar66 == 0) {
      uVar63 = (ulong)uVar62;
    }
    auVar78._8_8_ = 0;
    auVar78._0_4_ = cv_stack[uVar62].lower;
    auVar78._4_4_ = cv_stack[uVar62].upper;
    mask_stack[uVar62] = uVar66;
    fVar134 = (float)(iVar25 + 1) * 0.14285715;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * (float)iVar25 * 0.14285715)),
                              ZEXT416((uint)fVar97),
                              ZEXT416((uint)(1.0 - (float)iVar25 * 0.14285715)));
    auVar136 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar134)),ZEXT416((uint)fVar97),
                               ZEXT416((uint)(1.0 - fVar134)));
    fVar119 = auVar136._0_4_;
    auVar197._0_4_ = auVar16._0_4_;
    fVar97 = fVar119 - auVar197._0_4_;
    if (fVar97 < 0.16666667) {
      auVar148 = vshufps_avx(auVar78,auVar78,0x50);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar158 = vsubps_avx(auVar103,auVar148);
      fVar134 = auVar148._0_4_;
      auVar150._0_4_ = fVar134 * fVar147;
      fVar95 = auVar148._4_4_;
      auVar150._4_4_ = fVar95 * fVar264;
      fVar96 = auVar148._8_4_;
      auVar150._8_4_ = fVar96 * fVar147;
      fVar156 = auVar148._12_4_;
      auVar150._12_4_ = fVar156 * fVar264;
      auVar160._0_4_ = fVar134 * fVar276;
      auVar160._4_4_ = fVar95 * fVar277;
      auVar160._8_4_ = fVar96 * fVar276;
      auVar160._12_4_ = fVar156 * fVar277;
      auVar181._0_4_ = fVar134 * fVar204;
      auVar181._4_4_ = fVar95 * fVar217;
      auVar181._8_4_ = fVar96 * fVar204;
      auVar181._12_4_ = fVar156 * fVar217;
      auVar80._0_4_ = fVar134 * fVar218;
      auVar80._4_4_ = fVar95 * fVar233;
      auVar80._8_4_ = fVar96 * fVar218;
      auVar80._12_4_ = fVar156 * fVar233;
      auVar148 = vfmadd231ps_fma(auVar150,auVar158,auVar190);
      auVar159 = vfmadd231ps_fma(auVar160,auVar158,auVar237);
      auVar256 = vfmadd231ps_fma(auVar181,auVar158,auVar255);
      auVar158 = vfmadd231ps_fma(auVar80,auVar158,auVar267);
      auVar145._16_16_ = auVar148;
      auVar145._0_16_ = auVar148;
      auVar155._16_16_ = auVar159;
      auVar155._0_16_ = auVar159;
      auVar170._16_16_ = auVar256;
      auVar170._0_16_ = auVar256;
      auVar197._4_4_ = auVar197._0_4_;
      auVar197._8_4_ = auVar197._0_4_;
      auVar197._12_4_ = auVar197._0_4_;
      auVar197._20_4_ = fVar119;
      auVar197._16_4_ = fVar119;
      auVar197._24_4_ = fVar119;
      auVar197._28_4_ = fVar119;
      auVar90 = vsubps_avx(auVar155,auVar145);
      auVar159 = vfmadd213ps_fma(auVar90,auVar197,auVar145);
      auVar90 = vsubps_avx(auVar170,auVar155);
      auVar162 = vfmadd213ps_fma(auVar90,auVar197,auVar155);
      auVar148 = vsubps_avx(auVar158,auVar256);
      auVar92._16_16_ = auVar148;
      auVar92._0_16_ = auVar148;
      auVar148 = vfmadd213ps_fma(auVar92,auVar197,auVar170);
      auVar90 = vsubps_avx(ZEXT1632(auVar162),ZEXT1632(auVar159));
      auVar158 = vfmadd213ps_fma(auVar90,auVar197,ZEXT1632(auVar159));
      auVar90 = vsubps_avx(ZEXT1632(auVar148),ZEXT1632(auVar162));
      auVar148 = vfmadd213ps_fma(auVar90,auVar197,ZEXT1632(auVar162));
      auVar90 = vsubps_avx(ZEXT1632(auVar148),ZEXT1632(auVar158));
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar90,auVar197);
      fVar234 = auVar90._4_4_ * 3.0;
      local_4e8._0_4_ = fVar97;
      fVar134 = fVar97 * 0.33333334;
      auVar104._0_8_ =
           CONCAT44(auVar173._4_4_ + fVar134 * fVar234,
                    auVar173._0_4_ + fVar134 * auVar90._0_4_ * 3.0);
      auVar104._8_4_ = auVar173._8_4_ + fVar134 * auVar90._8_4_ * 3.0;
      auVar104._12_4_ = auVar173._12_4_ + fVar134 * auVar90._12_4_ * 3.0;
      auVar158 = vshufpd_avx(auVar173,auVar173,3);
      auVar159 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_508 = auVar158;
      auVar148 = vsubps_avx(auVar158,auVar173);
      auVar256 = vsubps_avx(auVar159,(undefined1  [16])0x0);
      auVar81._0_4_ = auVar148._0_4_ + auVar256._0_4_;
      auVar81._4_4_ = auVar148._4_4_ + auVar256._4_4_;
      auVar81._8_4_ = auVar148._8_4_ + auVar256._8_4_;
      auVar81._12_4_ = auVar148._12_4_ + auVar256._12_4_;
      auVar148 = vshufps_avx(auVar173,auVar173,0xb1);
      auVar256 = vshufps_avx(auVar104,auVar104,0xb1);
      auVar280._4_4_ = auVar81._0_4_;
      auVar280._0_4_ = auVar81._0_4_;
      auVar280._8_4_ = auVar81._0_4_;
      auVar280._12_4_ = auVar81._0_4_;
      auVar162 = vshufps_avx(auVar81,auVar81,0x55);
      fVar95 = auVar162._0_4_;
      auVar82._0_4_ = fVar95 * auVar148._0_4_;
      fVar96 = auVar162._4_4_;
      auVar82._4_4_ = fVar96 * auVar148._4_4_;
      fVar156 = auVar162._8_4_;
      auVar82._8_4_ = fVar156 * auVar148._8_4_;
      fVar74 = auVar162._12_4_;
      auVar82._12_4_ = fVar74 * auVar148._12_4_;
      auVar161._0_4_ = fVar95 * auVar256._0_4_;
      auVar161._4_4_ = fVar96 * auVar256._4_4_;
      auVar161._8_4_ = fVar156 * auVar256._8_4_;
      auVar161._12_4_ = fVar74 * auVar256._12_4_;
      auVar172 = vfmadd231ps_fma(auVar82,auVar280,auVar173);
      auVar248 = vfmadd231ps_fma(auVar161,auVar280,auVar104);
      auVar256 = vshufps_avx(auVar172,auVar172,0xe8);
      auVar162 = vshufps_avx(auVar248,auVar248,0xe8);
      auVar148 = vcmpps_avx(auVar256,auVar162,1);
      uVar66 = vextractps_avx(auVar148,0);
      auVar174 = auVar248;
      if ((uVar66 & 1) == 0) {
        auVar174 = auVar172;
      }
      auVar137._0_4_ = fVar134 * auVar90._16_4_ * 3.0;
      auVar137._4_4_ = fVar134 * fVar234;
      auVar137._8_4_ = fVar134 * auVar90._24_4_ * 3.0;
      auVar137._12_4_ = fVar134 * auVar232._28_4_;
      auVar177 = vsubps_avx((undefined1  [16])0x0,auVar137);
      auVar138 = vshufps_avx(auVar177,auVar177,0xb1);
      auVar175 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar191._0_4_ = fVar95 * auVar138._0_4_;
      auVar191._4_4_ = fVar96 * auVar138._4_4_;
      auVar191._8_4_ = fVar156 * auVar138._8_4_;
      auVar191._12_4_ = fVar74 * auVar138._12_4_;
      auVar208._0_4_ = auVar175._0_4_ * fVar95;
      auVar208._4_4_ = auVar175._4_4_ * fVar96;
      auVar208._8_4_ = auVar175._8_4_ * fVar156;
      auVar208._12_4_ = auVar175._12_4_ * fVar74;
      _local_438 = auVar177;
      auVar178 = vfmadd231ps_fma(auVar191,auVar280,auVar177);
      auVar179 = vfmadd231ps_fma(auVar208,(undefined1  [16])0x0,auVar280);
      auVar175 = vshufps_avx(auVar178,auVar178,0xe8);
      auVar176 = vshufps_avx(auVar179,auVar179,0xe8);
      auVar232 = ZEXT1664(auVar176);
      auVar138 = vcmpps_avx(auVar175,auVar176,1);
      uVar66 = vextractps_avx(auVar138,0);
      auVar188 = auVar179;
      if ((uVar66 & 1) == 0) {
        auVar188 = auVar178;
      }
      auVar174 = vmaxss_avx(auVar188,auVar174);
      auVar256 = vminps_avx(auVar256,auVar162);
      auVar162 = vminps_avx(auVar175,auVar176);
      auVar162 = vminps_avx(auVar256,auVar162);
      auVar148 = vshufps_avx(auVar148,auVar148,0x55);
      auVar148 = vblendps_avx(auVar148,auVar138,2);
      auVar138 = vpslld_avx(auVar148,0x1f);
      auVar148 = vshufpd_avx(auVar248,auVar248,1);
      auVar148 = vinsertps_avx(auVar148,auVar179,0x9c);
      auVar256 = vshufpd_avx(auVar172,auVar172,1);
      auVar256 = vinsertps_avx(auVar256,auVar178,0x9c);
      auVar148 = vblendvps_avx(auVar256,auVar148,auVar138);
      auVar256 = vmovshdup_avx(auVar148);
      auVar148 = vmaxss_avx(auVar256,auVar148);
      fVar156 = auVar162._0_4_;
      auVar256 = vmovshdup_avx(auVar162);
      fVar96 = auVar148._0_4_;
      fVar134 = auVar256._0_4_;
      fVar95 = auVar174._0_4_;
      if (((0.0001 <= fVar156) || (fVar96 <= -0.0001)) && (0.0001 <= fVar134 || fVar96 <= -0.0001))
      goto code_r0x0135d7d0;
      goto LAB_0135d7f6;
    }
    auVar16 = vinsertps_avx(auVar16,auVar136,0x10);
    goto LAB_0135cf17;
  }
  if (bVar69) goto LAB_0135e3a1;
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar73;
  auVar93._0_4_ = uVar73;
  auVar93._8_4_ = uVar73;
  auVar93._12_4_ = uVar73;
  auVar93._16_4_ = uVar73;
  auVar93._20_4_ = uVar73;
  auVar93._24_4_ = uVar73;
  auVar93._28_4_ = uVar73;
  auVar90 = vcmpps_avx(local_1d8,auVar93,2);
  uVar67 = vmovmskps_avx(auVar90);
  uVar67 = (uint)uVar70 & uVar67;
  goto LAB_0135c737;
code_r0x0135d7d0:
  auVar256 = vcmpps_avx(auVar256,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar172 = vcmpps_avx(auVar162,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar256 = vandps_avx(auVar172,auVar256);
  if (fVar95 <= -0.0001 || (auVar256 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0135d4ca;
LAB_0135d7f6:
  auVar232 = ZEXT1664(auVar159);
  auVar172 = vcmpps_avx(auVar162,_DAT_01f45a50,1);
  auVar248 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar256 = vcmpss_avx(auVar174,ZEXT816(0) << 0x20,1);
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = 0x3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar123._8_4_ = 0xbf800000;
  auVar123._0_8_ = 0xbf800000bf800000;
  auVar123._12_4_ = 0xbf800000;
  auVar256 = vblendvps_avx(auVar105,auVar123,auVar256);
  auVar172 = vblendvps_avx(auVar105,auVar123,auVar172);
  fVar234 = auVar172._0_4_;
  fVar74 = auVar256._0_4_;
  auVar256 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar234 == fVar74) && (!NAN(fVar234) && !NAN(fVar74))) {
    auVar256 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar234 == fVar74) && (!NAN(fVar234) && !NAN(fVar74))) {
    auVar248 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar172 = vmovshdup_avx(auVar172);
  fVar146 = auVar172._0_4_;
  auVar172 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar234 != fVar146) || (NAN(fVar234) || NAN(fVar146))) {
    if ((fVar134 != fVar156) || (NAN(fVar134) || NAN(fVar156))) {
      auVar139._0_8_ = auVar162._0_8_ ^ 0x8000000080000000;
      auVar139._8_4_ = auVar162._8_4_ ^ 0x80000000;
      auVar139._12_4_ = auVar162._12_4_ ^ 0x80000000;
      auVar140._0_4_ = -fVar156 / (fVar134 - fVar156);
      auVar140._4_12_ = auVar139._4_12_;
      auVar162 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar140._0_4_)),auVar140,ZEXT416(0));
      auVar138 = auVar162;
    }
    else {
      auVar162 = ZEXT816(0) << 0x20;
      if ((fVar156 != 0.0) || (auVar138 = auVar172, NAN(fVar156))) {
        auVar162 = SUB6416(ZEXT464(0x7f800000),0);
        auVar138 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar256 = vminss_avx(auVar256,auVar162);
    auVar248 = vmaxss_avx(auVar138,auVar248);
  }
  auVar148 = vcmpss_avx(auVar148,ZEXT416(0),1);
  auVar106._8_4_ = 0x3f800000;
  auVar106._0_8_ = 0x3f8000003f800000;
  auVar106._12_4_ = 0x3f800000;
  auVar124._8_4_ = 0xbf800000;
  auVar124._0_8_ = 0xbf800000bf800000;
  auVar124._12_4_ = 0xbf800000;
  auVar148 = vblendvps_avx(auVar106,auVar124,auVar148);
  fVar134 = auVar148._0_4_;
  if ((fVar74 != fVar134) || (NAN(fVar74) || NAN(fVar134))) {
    if ((fVar96 != fVar95) || (NAN(fVar96) || NAN(fVar95))) {
      auVar83._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
      auVar83._8_4_ = auVar174._8_4_ ^ 0x80000000;
      auVar83._12_4_ = auVar174._12_4_ ^ 0x80000000;
      auVar141._0_4_ = -fVar95 / (fVar96 - fVar95);
      auVar141._4_12_ = auVar83._4_12_;
      auVar148 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar141._0_4_)),auVar141,ZEXT416(0));
      auVar162 = auVar148;
    }
    else if ((fVar95 != 0.0) ||
            (auVar148 = auVar172, auVar162 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar95))) {
      auVar148 = SUB6416(ZEXT464(0xff800000),0);
      auVar162 = SUB6416(ZEXT464(0x7f800000),0);
    }
    auVar256 = vminss_avx(auVar256,auVar162);
    auVar248 = vmaxss_avx(auVar148,auVar248);
  }
  if ((fVar146 != fVar134) || (NAN(fVar146) || NAN(fVar134))) {
    auVar256 = vminss_avx(auVar256,auVar172);
    auVar248 = vmaxss_avx(auVar172,auVar248);
  }
  auVar148 = vmaxss_avx(ZEXT816(0) << 0x40,auVar256);
  auVar256 = vminss_avx(auVar248,auVar172);
  if (auVar256._0_4_ < auVar148._0_4_) goto LAB_0135d4ca;
  auVar148 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar148._0_4_ + -0.1)));
  auVar256 = vminss_avx(ZEXT416((uint)(auVar256._0_4_ + 0.1)),auVar172);
  auVar151._0_8_ = auVar173._0_8_;
  auVar151._8_8_ = auVar151._0_8_;
  auVar224._8_8_ = auVar104._0_8_;
  auVar224._0_8_ = auVar104._0_8_;
  auVar238._8_8_ = auVar177._0_8_;
  auVar238._0_8_ = auVar177._0_8_;
  auVar162 = vshufpd_avx(auVar104,auVar104,3);
  auVar172 = vshufpd_avx(auVar177,auVar177,3);
  auVar248 = vshufps_avx(auVar148,auVar256,0);
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar173 = vsubps_avx(auVar84,auVar248);
  local_508._0_4_ = auVar158._0_4_;
  local_508._4_4_ = auVar158._4_4_;
  fStack_500 = auVar158._8_4_;
  fStack_4fc = auVar158._12_4_;
  fVar134 = auVar248._0_4_;
  auVar85._0_4_ = fVar134 * (float)local_508._0_4_;
  fVar95 = auVar248._4_4_;
  auVar85._4_4_ = fVar95 * (float)local_508._4_4_;
  fVar96 = auVar248._8_4_;
  auVar85._8_4_ = fVar96 * fStack_500;
  fVar156 = auVar248._12_4_;
  auVar85._12_4_ = fVar156 * fStack_4fc;
  auVar182._0_4_ = fVar134 * auVar162._0_4_;
  auVar182._4_4_ = fVar95 * auVar162._4_4_;
  auVar182._8_4_ = fVar96 * auVar162._8_4_;
  auVar182._12_4_ = fVar156 * auVar162._12_4_;
  auVar192._0_4_ = fVar134 * auVar172._0_4_;
  auVar192._4_4_ = fVar95 * auVar172._4_4_;
  auVar192._8_4_ = fVar96 * auVar172._8_4_;
  auVar192._12_4_ = fVar156 * auVar172._12_4_;
  auVar209._0_4_ = fVar134 * auVar159._0_4_;
  auVar209._4_4_ = fVar95 * auVar159._4_4_;
  auVar209._8_4_ = fVar96 * auVar159._8_4_;
  auVar209._12_4_ = fVar156 * auVar159._12_4_;
  auVar162 = vfmadd231ps_fma(auVar85,auVar173,auVar151);
  auVar172 = vfmadd231ps_fma(auVar182,auVar173,auVar224);
  auVar248 = vfmadd231ps_fma(auVar192,auVar173,auVar238);
  auVar173 = vfmadd231ps_fma(auVar209,auVar173,ZEXT816(0));
  auVar158 = vmovshdup_avx(auVar78);
  auVar176 = vfmadd231ss_fma(ZEXT416((uint)(auVar158._0_4_ * auVar148._0_4_)),auVar78,
                             ZEXT416((uint)(1.0 - auVar148._0_4_)));
  auVar177 = vfmadd231ss_fma(ZEXT416((uint)(auVar158._0_4_ * auVar256._0_4_)),auVar78,
                             ZEXT416((uint)(1.0 - auVar256._0_4_)));
  fVar134 = 1.0 / fVar97;
  auVar78 = vsubps_avx(auVar172,auVar162);
  auVar225._0_4_ = auVar78._0_4_ * 3.0;
  auVar225._4_4_ = auVar78._4_4_ * 3.0;
  auVar225._8_4_ = auVar78._8_4_ * 3.0;
  auVar225._12_4_ = auVar78._12_4_ * 3.0;
  auVar78 = vsubps_avx(auVar248,auVar172);
  auVar239._0_4_ = auVar78._0_4_ * 3.0;
  auVar239._4_4_ = auVar78._4_4_ * 3.0;
  auVar239._8_4_ = auVar78._8_4_ * 3.0;
  auVar239._12_4_ = auVar78._12_4_ * 3.0;
  auVar78 = vsubps_avx(auVar173,auVar248);
  auVar249._0_4_ = auVar78._0_4_ * 3.0;
  auVar249._4_4_ = auVar78._4_4_ * 3.0;
  auVar249._8_4_ = auVar78._8_4_ * 3.0;
  auVar249._12_4_ = auVar78._12_4_ * 3.0;
  auVar148 = vminps_avx(auVar239,auVar249);
  auVar78 = vmaxps_avx(auVar239,auVar249);
  auVar148 = vminps_avx(auVar225,auVar148);
  auVar78 = vmaxps_avx(auVar225,auVar78);
  auVar158 = vshufpd_avx(auVar148,auVar148,3);
  auVar159 = vshufpd_avx(auVar78,auVar78,3);
  auVar148 = vminps_avx(auVar148,auVar158);
  auVar78 = vmaxps_avx(auVar78,auVar159);
  auVar240._0_4_ = auVar148._0_4_ * fVar134;
  auVar240._4_4_ = auVar148._4_4_ * fVar134;
  auVar240._8_4_ = auVar148._8_4_ * fVar134;
  auVar240._12_4_ = auVar148._12_4_ * fVar134;
  auVar226._0_4_ = auVar78._0_4_ * fVar134;
  auVar226._4_4_ = auVar78._4_4_ * fVar134;
  auVar226._8_4_ = auVar78._8_4_ * fVar134;
  auVar226._12_4_ = auVar78._12_4_ * fVar134;
  fVar134 = 1.0 / (auVar177._0_4_ - auVar176._0_4_);
  auVar78 = vshufpd_avx(auVar162,auVar162,3);
  auVar148 = vshufpd_avx(auVar172,auVar172,3);
  auVar158 = vshufpd_avx(auVar248,auVar248,3);
  auVar159 = vshufpd_avx(auVar173,auVar173,3);
  auVar78 = vsubps_avx(auVar78,auVar162);
  auVar256 = vsubps_avx(auVar148,auVar172);
  auVar162 = vsubps_avx(auVar158,auVar248);
  auVar159 = vsubps_avx(auVar159,auVar173);
  auVar148 = vminps_avx(auVar78,auVar256);
  auVar78 = vmaxps_avx(auVar78,auVar256);
  auVar158 = vminps_avx(auVar162,auVar159);
  auVar158 = vminps_avx(auVar148,auVar158);
  auVar148 = vmaxps_avx(auVar162,auVar159);
  auVar78 = vmaxps_avx(auVar78,auVar148);
  auVar268._0_4_ = fVar134 * auVar158._0_4_;
  auVar268._4_4_ = fVar134 * auVar158._4_4_;
  auVar268._8_4_ = fVar134 * auVar158._8_4_;
  auVar268._12_4_ = fVar134 * auVar158._12_4_;
  auVar257._0_4_ = fVar134 * auVar78._0_4_;
  auVar257._4_4_ = fVar134 * auVar78._4_4_;
  auVar257._8_4_ = fVar134 * auVar78._8_4_;
  auVar257._12_4_ = fVar134 * auVar78._12_4_;
  auVar159 = vinsertps_avx(auVar16,auVar176,0x10);
  auVar256 = vinsertps_avx(auVar136,auVar177,0x10);
  auVar250._0_4_ = (auVar159._0_4_ + auVar256._0_4_) * 0.5;
  auVar250._4_4_ = (auVar159._4_4_ + auVar256._4_4_) * 0.5;
  auVar250._8_4_ = (auVar159._8_4_ + auVar256._8_4_) * 0.5;
  auVar250._12_4_ = (auVar159._12_4_ + auVar256._12_4_) * 0.5;
  auVar86._4_4_ = auVar250._0_4_;
  auVar86._0_4_ = auVar250._0_4_;
  auVar86._8_4_ = auVar250._0_4_;
  auVar86._12_4_ = auVar250._0_4_;
  auVar136 = vfmadd213ps_fma(auVar17,auVar86,auVar5);
  auVar148 = vfmadd213ps_fma(auVar4,auVar86,auVar6);
  auVar158 = vfmadd213ps_fma(auVar100,auVar86,auVar7);
  auVar78 = vsubps_avx(auVar148,auVar136);
  auVar136 = vfmadd213ps_fma(auVar78,auVar86,auVar136);
  auVar78 = vsubps_avx(auVar158,auVar148);
  auVar78 = vfmadd213ps_fma(auVar78,auVar86,auVar148);
  auVar78 = vsubps_avx(auVar78,auVar136);
  auVar136 = vfmadd231ps_fma(auVar136,auVar78,auVar86);
  auVar87._0_8_ = CONCAT44(auVar78._4_4_ * 3.0,auVar78._0_4_ * 3.0);
  auVar87._8_4_ = auVar78._8_4_ * 3.0;
  auVar87._12_4_ = auVar78._12_4_ * 3.0;
  auVar281._8_8_ = auVar136._0_8_;
  auVar281._0_8_ = auVar136._0_8_;
  auVar78 = vshufpd_avx(auVar136,auVar136,3);
  auVar136 = vshufps_avx(auVar250,auVar250,0x55);
  auVar172 = vsubps_avx(auVar78,auVar281);
  auVar173 = vfmadd231ps_fma(auVar281,auVar136,auVar172);
  auVar288._8_8_ = auVar87._0_8_;
  auVar288._0_8_ = auVar87._0_8_;
  auVar78 = vshufpd_avx(auVar87,auVar87,3);
  auVar78 = vsubps_avx(auVar78,auVar288);
  auVar248 = vfmadd213ps_fma(auVar78,auVar136,auVar288);
  auVar136 = vmovshdup_avx(auVar248);
  auVar289._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
  auVar289._8_4_ = auVar136._8_4_ ^ 0x80000000;
  auVar289._12_4_ = auVar136._12_4_ ^ 0x80000000;
  auVar148 = vmovshdup_avx(auVar172);
  auVar78 = vunpcklps_avx(auVar148,auVar289);
  auVar158 = vshufps_avx(auVar78,auVar289,4);
  auVar162 = vshufps_avx(auVar250,auVar250,0x54);
  auVar142._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
  auVar142._8_4_ = auVar172._8_4_ ^ 0x80000000;
  auVar142._12_4_ = auVar172._12_4_ ^ 0x80000000;
  auVar78 = vmovlhps_avx(auVar142,auVar248);
  auVar78 = vshufps_avx(auVar78,auVar248,8);
  auVar136 = vfmsub231ss_fma(ZEXT416((uint)(auVar172._0_4_ * auVar136._0_4_)),auVar148,auVar248);
  uVar73 = auVar136._0_4_;
  auVar88._4_4_ = uVar73;
  auVar88._0_4_ = uVar73;
  auVar88._8_4_ = uVar73;
  auVar88._12_4_ = uVar73;
  auVar136 = vdivps_avx(auVar158,auVar88);
  auVar148 = vdivps_avx(auVar78,auVar88);
  fVar96 = auVar173._0_4_;
  fVar134 = auVar136._0_4_;
  auVar78 = vshufps_avx(auVar173,auVar173,0x55);
  fVar95 = auVar148._0_4_;
  auVar89._0_4_ = fVar96 * fVar134 + auVar78._0_4_ * fVar95;
  auVar89._4_4_ = fVar96 * auVar136._4_4_ + auVar78._4_4_ * auVar148._4_4_;
  auVar89._8_4_ = fVar96 * auVar136._8_4_ + auVar78._8_4_ * auVar148._8_4_;
  auVar89._12_4_ = fVar96 * auVar136._12_4_ + auVar78._12_4_ * auVar148._12_4_;
  auVar175 = vsubps_avx(auVar162,auVar89);
  auVar162 = vmovshdup_avx(auVar136);
  auVar78 = vinsertps_avx(auVar240,auVar268,0x1c);
  auVar163._0_4_ = auVar162._0_4_ * auVar78._0_4_;
  auVar163._4_4_ = auVar162._4_4_ * auVar78._4_4_;
  auVar163._8_4_ = auVar162._8_4_ * auVar78._8_4_;
  auVar163._12_4_ = auVar162._12_4_ * auVar78._12_4_;
  auVar158 = vinsertps_avx(auVar226,auVar257,0x1c);
  auVar107._0_4_ = auVar158._0_4_ * auVar162._0_4_;
  auVar107._4_4_ = auVar158._4_4_ * auVar162._4_4_;
  auVar107._8_4_ = auVar158._8_4_ * auVar162._8_4_;
  auVar107._12_4_ = auVar158._12_4_ * auVar162._12_4_;
  auVar173 = vminps_avx(auVar163,auVar107);
  auVar248 = vmaxps_avx(auVar107,auVar163);
  auVar162 = vinsertps_avx(auVar268,auVar240,0x4c);
  auVar174 = vmovshdup_avx(auVar148);
  auVar172 = vinsertps_avx(auVar257,auVar226,0x4c);
  auVar258._0_4_ = auVar174._0_4_ * auVar162._0_4_;
  auVar258._4_4_ = auVar174._4_4_ * auVar162._4_4_;
  auVar258._8_4_ = auVar174._8_4_ * auVar162._8_4_;
  auVar258._12_4_ = auVar174._12_4_ * auVar162._12_4_;
  auVar241._0_4_ = auVar174._0_4_ * auVar172._0_4_;
  auVar241._4_4_ = auVar174._4_4_ * auVar172._4_4_;
  auVar241._8_4_ = auVar174._8_4_ * auVar172._8_4_;
  auVar241._12_4_ = auVar174._12_4_ * auVar172._12_4_;
  auVar174 = vminps_avx(auVar258,auVar241);
  auVar269._0_4_ = auVar173._0_4_ + auVar174._0_4_;
  auVar269._4_4_ = auVar173._4_4_ + auVar174._4_4_;
  auVar269._8_4_ = auVar173._8_4_ + auVar174._8_4_;
  auVar269._12_4_ = auVar173._12_4_ + auVar174._12_4_;
  auVar173 = vmaxps_avx(auVar241,auVar258);
  auVar108._0_4_ = auVar173._0_4_ + auVar248._0_4_;
  auVar108._4_4_ = auVar173._4_4_ + auVar248._4_4_;
  auVar108._8_4_ = auVar173._8_4_ + auVar248._8_4_;
  auVar108._12_4_ = auVar173._12_4_ + auVar248._12_4_;
  auVar242._8_8_ = 0x3f80000000000000;
  auVar242._0_8_ = 0x3f80000000000000;
  auVar248 = vsubps_avx(auVar242,auVar108);
  auVar173 = vsubps_avx(auVar242,auVar269);
  auVar174 = vsubps_avx(auVar159,auVar250);
  auVar138 = vsubps_avx(auVar256,auVar250);
  auVar125._0_4_ = fVar134 * auVar78._0_4_;
  auVar125._4_4_ = fVar134 * auVar78._4_4_;
  auVar125._8_4_ = fVar134 * auVar78._8_4_;
  auVar125._12_4_ = fVar134 * auVar78._12_4_;
  auVar270._0_4_ = fVar134 * auVar158._0_4_;
  auVar270._4_4_ = fVar134 * auVar158._4_4_;
  auVar270._8_4_ = fVar134 * auVar158._8_4_;
  auVar270._12_4_ = fVar134 * auVar158._12_4_;
  auVar158 = vminps_avx(auVar125,auVar270);
  auVar78 = vmaxps_avx(auVar270,auVar125);
  auVar164._0_4_ = fVar95 * auVar162._0_4_;
  auVar164._4_4_ = fVar95 * auVar162._4_4_;
  auVar164._8_4_ = fVar95 * auVar162._8_4_;
  auVar164._12_4_ = fVar95 * auVar162._12_4_;
  auVar227._0_4_ = fVar95 * auVar172._0_4_;
  auVar227._4_4_ = fVar95 * auVar172._4_4_;
  auVar227._8_4_ = fVar95 * auVar172._8_4_;
  auVar227._12_4_ = fVar95 * auVar172._12_4_;
  auVar162 = vminps_avx(auVar164,auVar227);
  auVar271._0_4_ = auVar158._0_4_ + auVar162._0_4_;
  auVar271._4_4_ = auVar158._4_4_ + auVar162._4_4_;
  auVar271._8_4_ = auVar158._8_4_ + auVar162._8_4_;
  auVar271._12_4_ = auVar158._12_4_ + auVar162._12_4_;
  fVar146 = auVar174._0_4_;
  auVar282._0_4_ = fVar146 * auVar248._0_4_;
  fVar278 = auVar174._4_4_;
  auVar282._4_4_ = fVar278 * auVar248._4_4_;
  fVar198 = auVar174._8_4_;
  auVar282._8_4_ = fVar198 * auVar248._8_4_;
  fVar199 = auVar174._12_4_;
  auVar282._12_4_ = fVar199 * auVar248._12_4_;
  auVar158 = vmaxps_avx(auVar227,auVar164);
  auVar228._0_4_ = fVar146 * auVar173._0_4_;
  auVar228._4_4_ = fVar278 * auVar173._4_4_;
  auVar228._8_4_ = fVar198 * auVar173._8_4_;
  auVar228._12_4_ = fVar199 * auVar173._12_4_;
  fVar96 = auVar138._0_4_;
  auVar109._0_4_ = fVar96 * auVar248._0_4_;
  fVar156 = auVar138._4_4_;
  auVar109._4_4_ = fVar156 * auVar248._4_4_;
  fVar74 = auVar138._8_4_;
  auVar109._8_4_ = fVar74 * auVar248._8_4_;
  fVar234 = auVar138._12_4_;
  auVar109._12_4_ = fVar234 * auVar248._12_4_;
  auVar243._0_4_ = fVar96 * auVar173._0_4_;
  auVar243._4_4_ = fVar156 * auVar173._4_4_;
  auVar243._8_4_ = fVar74 * auVar173._8_4_;
  auVar243._12_4_ = fVar234 * auVar173._12_4_;
  auVar126._0_4_ = auVar78._0_4_ + auVar158._0_4_;
  auVar126._4_4_ = auVar78._4_4_ + auVar158._4_4_;
  auVar126._8_4_ = auVar78._8_4_ + auVar158._8_4_;
  auVar126._12_4_ = auVar78._12_4_ + auVar158._12_4_;
  auVar165._8_8_ = 0x3f800000;
  auVar165._0_8_ = 0x3f800000;
  auVar78 = vsubps_avx(auVar165,auVar126);
  auVar158 = vsubps_avx(auVar165,auVar271);
  auVar272._0_4_ = fVar146 * auVar78._0_4_;
  auVar272._4_4_ = fVar278 * auVar78._4_4_;
  auVar272._8_4_ = fVar198 * auVar78._8_4_;
  auVar272._12_4_ = fVar199 * auVar78._12_4_;
  auVar259._0_4_ = fVar146 * auVar158._0_4_;
  auVar259._4_4_ = fVar278 * auVar158._4_4_;
  auVar259._8_4_ = fVar198 * auVar158._8_4_;
  auVar259._12_4_ = fVar199 * auVar158._12_4_;
  auVar127._0_4_ = fVar96 * auVar78._0_4_;
  auVar127._4_4_ = fVar156 * auVar78._4_4_;
  auVar127._8_4_ = fVar74 * auVar78._8_4_;
  auVar127._12_4_ = fVar234 * auVar78._12_4_;
  auVar166._0_4_ = fVar96 * auVar158._0_4_;
  auVar166._4_4_ = fVar156 * auVar158._4_4_;
  auVar166._8_4_ = fVar74 * auVar158._8_4_;
  auVar166._12_4_ = fVar234 * auVar158._12_4_;
  auVar78 = vminps_avx(auVar272,auVar259);
  auVar158 = vminps_avx(auVar127,auVar166);
  auVar78 = vminps_avx(auVar78,auVar158);
  auVar158 = vmaxps_avx(auVar259,auVar272);
  auVar162 = vmaxps_avx(auVar166,auVar127);
  auVar172 = vminps_avx(auVar282,auVar228);
  auVar248 = vminps_avx(auVar109,auVar243);
  auVar172 = vminps_avx(auVar172,auVar248);
  auVar78 = vhaddps_avx(auVar78,auVar172);
  auVar158 = vmaxps_avx(auVar162,auVar158);
  auVar162 = vmaxps_avx(auVar228,auVar282);
  auVar172 = vmaxps_avx(auVar243,auVar109);
  auVar162 = vmaxps_avx(auVar172,auVar162);
  auVar158 = vhaddps_avx(auVar158,auVar162);
  auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
  auVar158 = vshufps_avx(auVar158,auVar158,0xe8);
  auVar244._0_4_ = auVar175._0_4_ + auVar78._0_4_;
  auVar244._4_4_ = auVar175._4_4_ + auVar78._4_4_;
  auVar244._8_4_ = auVar175._8_4_ + auVar78._8_4_;
  auVar244._12_4_ = auVar175._12_4_ + auVar78._12_4_;
  auVar229._0_4_ = auVar175._0_4_ + auVar158._0_4_;
  auVar229._4_4_ = auVar175._4_4_ + auVar158._4_4_;
  auVar229._8_4_ = auVar175._8_4_ + auVar158._8_4_;
  auVar229._12_4_ = auVar175._12_4_ + auVar158._12_4_;
  auVar232 = ZEXT1664(auVar229);
  auVar78 = vmaxps_avx(auVar159,auVar244);
  auVar158 = vminps_avx(auVar229,auVar256);
  auVar78 = vcmpps_avx(auVar158,auVar78,1);
  auVar78 = vshufps_avx(auVar78,auVar78,0x50);
  if ((auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar78[0xf] < '\0')
  goto LAB_0135d4ca;
  bVar65 = 0;
  if ((auVar197._0_4_ < auVar244._0_4_) && (bVar65 = 0, auVar229._0_4_ < auVar256._0_4_)) {
    auVar158 = vmovshdup_avx(auVar244);
    auVar78 = vcmpps_avx(auVar229,auVar256,1);
    bVar65 = auVar78[4] & auVar176._0_4_ < auVar158._0_4_;
  }
  auVar232 = ZEXT464(0x40400000);
  p03.field_0.i[0] = auVar8._0_4_;
  p03.field_0.i[1] = auVar8._4_4_;
  p03.field_0.i[2] = auVar8._8_4_;
  p03.field_0.i[3] = auVar8._12_4_;
  if (((3 < (uint)uVar63 || fVar97 < 0.001) | bVar65) == 1) {
    lVar64 = 0xc9;
    do {
      lVar64 = lVar64 + -1;
      if (lVar64 == 0) goto LAB_0135d4ca;
      fVar156 = auVar175._0_4_;
      fVar96 = 1.0 - fVar156;
      fVar97 = fVar96 * fVar96 * fVar96;
      fVar119 = fVar156 * 3.0 * fVar96 * fVar96;
      fVar96 = fVar96 * fVar156 * fVar156 * 3.0;
      auVar152._4_4_ = fVar97;
      auVar152._0_4_ = fVar97;
      auVar152._8_4_ = fVar97;
      auVar152._12_4_ = fVar97;
      auVar128._4_4_ = fVar119;
      auVar128._0_4_ = fVar119;
      auVar128._8_4_ = fVar119;
      auVar128._12_4_ = fVar119;
      auVar110._4_4_ = fVar96;
      auVar110._0_4_ = fVar96;
      auVar110._8_4_ = fVar96;
      auVar110._12_4_ = fVar96;
      fVar156 = fVar156 * fVar156 * fVar156;
      auVar167._0_4_ = p03.field_0.v[0] * fVar156;
      auVar167._4_4_ = p03.field_0.v[1] * fVar156;
      auVar167._8_4_ = p03.field_0.v[2] * fVar156;
      auVar167._12_4_ = p03.field_0.v[3] * fVar156;
      auVar16 = vfmadd231ps_fma(auVar167,auVar7,auVar110);
      auVar16 = vfmadd231ps_fma(auVar16,auVar6,auVar128);
      auVar16 = vfmadd231ps_fma(auVar16,auVar5,auVar152);
      auVar111._8_8_ = auVar16._0_8_;
      auVar111._0_8_ = auVar16._0_8_;
      auVar16 = vshufpd_avx(auVar16,auVar16,3);
      auVar78 = vshufps_avx(auVar175,auVar175,0x55);
      auVar16 = vsubps_avx(auVar16,auVar111);
      auVar78 = vfmadd213ps_fma(auVar16,auVar78,auVar111);
      fVar97 = auVar78._0_4_;
      auVar16 = vshufps_avx(auVar78,auVar78,0x55);
      auVar112._0_4_ = fVar134 * fVar97 + fVar95 * auVar16._0_4_;
      auVar112._4_4_ = auVar136._4_4_ * fVar97 + auVar148._4_4_ * auVar16._4_4_;
      auVar112._8_4_ = auVar136._8_4_ * fVar97 + auVar148._8_4_ * auVar16._8_4_;
      auVar112._12_4_ = auVar136._12_4_ * fVar97 + auVar148._12_4_ * auVar16._12_4_;
      auVar175 = vsubps_avx(auVar175,auVar112);
      auVar16 = vandps_avx(auVar236,auVar78);
      auVar78 = vshufps_avx(auVar16,auVar16,0xf5);
      auVar16 = vmaxss_avx(auVar78,auVar16);
    } while (fVar94 <= auVar16._0_4_);
    local_238 = auVar175._0_4_;
    if ((0.0 <= local_238) && (local_238 <= 1.0)) {
      auVar16 = vmovshdup_avx(auVar175);
      fVar97 = auVar16._0_4_;
      if ((0.0 <= fVar97) && (fVar97 <= 1.0)) {
        auVar16 = vinsertps_avx(ZEXT416((uint)(pLVar61->vx).field_0.m128[2]),
                                ZEXT416(*(uint *)((long)&(pLVar61->vy).field_0 + 8)),0x1c);
        auVar162 = vinsertps_avx(auVar16,ZEXT416(*(uint *)((long)&(pLVar61->vz).field_0 + 8)),0x28);
        auVar16 = vdpps_avx(auVar162,local_448,0x7f);
        auVar78 = vdpps_avx(auVar162,local_458,0x7f);
        auVar136 = vdpps_avx(auVar162,auVar220,0x7f);
        auVar148 = vdpps_avx(auVar162,auVar9,0x7f);
        auVar158 = vdpps_avx(auVar162,auVar75,0x7f);
        auVar159 = vdpps_avx(auVar162,auVar157,0x7f);
        auVar256 = vdpps_avx(auVar162,auVar76,0x7f);
        auVar162 = vdpps_avx(auVar162,auVar99,0x7f);
        fVar119 = 1.0 - fVar97;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * auVar158._0_4_)),ZEXT416((uint)fVar119),
                                  auVar16);
        auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar159._0_4_ * fVar97)),ZEXT416((uint)fVar119),
                                  auVar78);
        auVar136 = vfmadd231ss_fma(ZEXT416((uint)(auVar256._0_4_ * fVar97)),ZEXT416((uint)fVar119),
                                   auVar136);
        auVar232 = ZEXT1664(auVar136);
        auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * auVar162._0_4_)),ZEXT416((uint)fVar119),
                                   auVar148);
        fVar95 = 1.0 - local_238;
        fVar97 = fVar95 * local_238 * local_238 * 3.0;
        fVar156 = local_238 * local_238 * local_238;
        auVar136 = vfmadd231ss_fma(ZEXT416((uint)(auVar148._0_4_ * fVar156)),ZEXT416((uint)fVar97),
                                   auVar136);
        fVar119 = local_238 * 3.0 * fVar95 * fVar95;
        auVar78 = vfmadd231ss_fma(auVar136,ZEXT416((uint)fVar119),auVar78);
        fVar134 = fVar95 * fVar95 * fVar95;
        auVar16 = vfmadd231ss_fma(auVar78,ZEXT416((uint)fVar134),auVar16);
        fVar96 = auVar16._0_4_;
        if ((fVar72 <= fVar96) && (fVar74 = *(float *)(ray + k * 4 + 0x80), fVar96 <= fVar74)) {
          pGVar12 = (context->scene->geometries).items[uVar67].ptr;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar71 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar71 = true, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_228 = vshufps_avx(auVar175,auVar175,0x55);
            auVar210._8_4_ = 0x3f800000;
            auVar210._0_8_ = 0x3f8000003f800000;
            auVar210._12_4_ = 0x3f800000;
            auVar16 = vsubps_avx(auVar210,local_228);
            fVar234 = local_228._0_4_;
            auVar230._0_4_ = fVar234 * (float)local_478._0_4_;
            fVar146 = local_228._4_4_;
            auVar230._4_4_ = fVar146 * (float)local_478._4_4_;
            fVar278 = local_228._8_4_;
            auVar230._8_4_ = fVar278 * fStack_470;
            fVar198 = local_228._12_4_;
            auVar230._12_4_ = fVar198 * fStack_46c;
            auVar245._0_4_ = fVar234 * (float)local_4b8._0_4_;
            auVar245._4_4_ = fVar146 * (float)local_4b8._4_4_;
            auVar245._8_4_ = fVar278 * fStack_4b0;
            auVar245._12_4_ = fVar198 * fStack_4ac;
            auVar251._0_4_ = fVar234 * (float)local_4c8._0_4_;
            auVar251._4_4_ = fVar146 * (float)local_4c8._4_4_;
            auVar251._8_4_ = fVar278 * fStack_4c0;
            auVar251._12_4_ = fVar198 * fStack_4bc;
            auVar260._0_4_ = fVar234 * fVar171;
            auVar260._4_4_ = fVar146 * fVar185;
            auVar260._8_4_ = fVar278 * fVar186;
            auVar260._12_4_ = fVar198 * fVar187;
            auVar78 = vfmadd231ps_fma(auVar230,auVar16,local_468);
            auVar136 = vfmadd231ps_fma(auVar245,auVar16,local_498);
            auVar148 = vfmadd231ps_fma(auVar251,auVar16,local_4a8);
            auVar158 = vfmadd231ps_fma(auVar260,auVar16,local_488);
            auVar16 = vsubps_avx(auVar136,auVar78);
            auVar78 = vsubps_avx(auVar148,auVar136);
            auVar232 = ZEXT1664(auVar78);
            auVar136 = vsubps_avx(auVar158,auVar148);
            auVar252._0_4_ = auVar78._0_4_ * local_238;
            auVar252._4_4_ = auVar78._4_4_ * local_238;
            auVar252._8_4_ = auVar78._8_4_ * local_238;
            auVar252._12_4_ = auVar78._12_4_ * local_238;
            auVar183._4_4_ = fVar95;
            auVar183._0_4_ = fVar95;
            auVar183._8_4_ = fVar95;
            auVar183._12_4_ = fVar95;
            auVar16 = vfmadd231ps_fma(auVar252,auVar183,auVar16);
            auVar211._0_4_ = auVar136._0_4_ * local_238;
            auVar211._4_4_ = auVar136._4_4_ * local_238;
            auVar211._8_4_ = auVar136._8_4_ * local_238;
            auVar211._12_4_ = auVar136._12_4_ * local_238;
            auVar136 = vfmadd231ps_fma(auVar211,auVar183,auVar78);
            auVar212._0_4_ = auVar136._0_4_ * local_238;
            auVar212._4_4_ = auVar136._4_4_ * local_238;
            auVar212._8_4_ = auVar136._8_4_ * local_238;
            auVar212._12_4_ = auVar136._12_4_ * local_238;
            auVar136 = vfmadd231ps_fma(auVar212,auVar183,auVar16);
            local_3b8 = auVar27._0_4_;
            fStack_3b4 = auVar27._4_4_;
            fStack_3b0 = auVar27._8_4_;
            fStack_3ac = auVar27._12_4_;
            auVar168._0_4_ = fVar156 * local_3b8;
            auVar168._4_4_ = fVar156 * fStack_3b4;
            auVar168._8_4_ = fVar156 * fStack_3b0;
            auVar168._12_4_ = fVar156 * fStack_3ac;
            auVar129._4_4_ = fVar97;
            auVar129._0_4_ = fVar97;
            auVar129._8_4_ = fVar97;
            auVar129._12_4_ = fVar97;
            auVar16 = vfmadd132ps_fma(auVar129,auVar168,auVar101);
            auVar153._4_4_ = fVar119;
            auVar153._0_4_ = fVar119;
            auVar153._8_4_ = fVar119;
            auVar153._12_4_ = fVar119;
            auVar16 = vfmadd132ps_fma(auVar153,auVar16,auVar77);
            auVar130._0_4_ = auVar136._0_4_ * 3.0;
            auVar130._4_4_ = auVar136._4_4_ * 3.0;
            auVar130._8_4_ = auVar136._8_4_ * 3.0;
            auVar130._12_4_ = auVar136._12_4_ * 3.0;
            auVar143._4_4_ = fVar134;
            auVar143._0_4_ = fVar134;
            auVar143._8_4_ = fVar134;
            auVar143._12_4_ = fVar134;
            auVar136 = vfmadd132ps_fma(auVar143,auVar16,auVar26);
            auVar16 = vshufps_avx(auVar130,auVar130,0xc9);
            auVar154._0_4_ = auVar136._0_4_ * auVar16._0_4_;
            auVar154._4_4_ = auVar136._4_4_ * auVar16._4_4_;
            auVar154._8_4_ = auVar136._8_4_ * auVar16._8_4_;
            auVar154._12_4_ = auVar136._12_4_ * auVar16._12_4_;
            auVar16 = vshufps_avx(auVar136,auVar136,0xc9);
            auVar136 = vfmsub231ps_fma(auVar154,auVar130,auVar16);
            auVar16 = vshufps_avx(auVar136,auVar136,0x55);
            local_268[0] = (RTCHitN)auVar16[0];
            local_268[1] = (RTCHitN)auVar16[1];
            local_268[2] = (RTCHitN)auVar16[2];
            local_268[3] = (RTCHitN)auVar16[3];
            local_268[4] = (RTCHitN)auVar16[4];
            local_268[5] = (RTCHitN)auVar16[5];
            local_268[6] = (RTCHitN)auVar16[6];
            local_268[7] = (RTCHitN)auVar16[7];
            local_268[8] = (RTCHitN)auVar16[8];
            local_268[9] = (RTCHitN)auVar16[9];
            local_268[10] = (RTCHitN)auVar16[10];
            local_268[0xb] = (RTCHitN)auVar16[0xb];
            local_268[0xc] = (RTCHitN)auVar16[0xc];
            local_268[0xd] = (RTCHitN)auVar16[0xd];
            local_268[0xe] = (RTCHitN)auVar16[0xe];
            local_268[0xf] = (RTCHitN)auVar16[0xf];
            local_258 = vshufps_avx(auVar136,auVar136,0xaa);
            local_248 = auVar136._0_4_;
            uStack_244 = local_248;
            uStack_240 = local_248;
            uStack_23c = local_248;
            fStack_234 = local_238;
            fStack_230 = local_238;
            fStack_22c = local_238;
            local_218 = CONCAT44(uVar11,uVar11);
            uStack_210 = CONCAT44(uVar11,uVar11);
            local_208._4_4_ = uVar67;
            local_208._0_4_ = uVar67;
            local_208._8_4_ = uVar67;
            local_208._12_4_ = uVar67;
            vpcmpeqd_avx2(ZEXT1632(local_208),ZEXT1632(local_208));
            uStack_1f4 = context->user->instID[0];
            local_1f8 = uStack_1f4;
            uStack_1f0 = uStack_1f4;
            uStack_1ec = uStack_1f4;
            uStack_1e8 = context->user->instPrimID[0];
            uStack_1e4 = uStack_1e8;
            uStack_1e0 = uStack_1e8;
            uStack_1dc = uStack_1e8;
            *(float *)(ray + k * 4 + 0x80) = fVar96;
            local_538 = *local_520;
            args.valid = (int *)local_538;
            args.geometryUserPtr = pGVar12->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_268;
            args.N = 4;
            if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar232 = ZEXT1664(auVar78);
              (*pGVar12->occlusionFilterN)(&args);
            }
            if (local_538 == (undefined1  [16])0x0) {
              auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar16 = auVar16 ^ _DAT_01f46b70;
            }
            else {
              p_Var13 = context->args->filter;
              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0))))
              {
                auVar232 = ZEXT1664(auVar232._0_16_);
                (*p_Var13)(&args);
              }
              auVar78 = vpcmpeqd_avx(local_538,_DAT_01f45a50);
              auVar16 = auVar78 ^ _DAT_01f46b70;
              auVar131._8_4_ = 0xff800000;
              auVar131._0_8_ = 0xff800000ff800000;
              auVar131._12_4_ = 0xff800000;
              auVar78 = vblendvps_avx(auVar131,*(undefined1 (*) [16])(args.ray + 0x80),auVar78);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar78;
            }
            auVar113._8_8_ = 0x100000001;
            auVar113._0_8_ = 0x100000001;
            bVar71 = (auVar113 & auVar16) != (undefined1  [16])0x0;
            if (!bVar71) {
              *(float *)(ray + k * 4 + 0x80) = fVar74;
            }
          }
          bVar69 = (bool)(bVar69 | bVar71);
        }
      }
    }
    goto LAB_0135d4ca;
  }
  auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar119),0x10);
  auVar78 = vinsertps_avx(auVar176,ZEXT416((uint)auVar177._0_4_),0x10);
  goto LAB_0135cf17;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }